

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-quants.c
# Opt level: O0

void ggml_vec_dot_q6_K_q8_K(int n,float *s,size_t bs,void *vx,size_t bx,void *vy,size_t by,int nrc)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined8 uVar14;
  undefined8 uVar15;
  __m256 x_00;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  long in_RCX;
  float *in_RSI;
  int in_EDI;
  long in_R9;
  float fVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  __m256i p16_3;
  __m256i p16_2;
  __m256i p16_1;
  __m256i p16_0;
  __m256i q8s_3;
  __m256i q8s_2;
  __m256i q8s_1;
  __m256i q8s_0;
  __m256i q8_3;
  __m256i q8_2;
  __m256i q8_1;
  __m256i q8_0;
  __m256i q4_3;
  __m256i q4_2;
  __m256i q4_1;
  __m256i q4_0;
  __m256i q4h_3;
  __m256i q4h_2;
  __m256i q4h_1;
  __m256i q4h_0;
  __m256i q4bitsH;
  __m256i q4bits2;
  __m256i q4bits1;
  __m128i scale_3;
  __m128i scale_2;
  __m128i scale_1;
  __m128i scale_0;
  int j;
  int is;
  __m256i sumi;
  __m128i scales;
  int8_t *q8;
  uint8_t *qh;
  uint8_t *q4;
  float d;
  int i;
  __m256 acc;
  __m256i m32s;
  __m256i m2;
  __m256i m4;
  int nb;
  block_q8_K *y;
  block_q6_K *x;
  undefined8 in_stack_ffffffffffffedd8;
  undefined8 in_stack_ffffffffffffede0;
  undefined8 in_stack_ffffffffffffede8;
  undefined8 in_stack_ffffffffffffedf0;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 local_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  int local_ea8;
  int local_ea4;
  undefined1 local_ea0 [32];
  undefined1 (*local_e60) [32];
  undefined1 (*local_e58) [32];
  undefined1 (*local_e50) [32];
  float local_e48;
  int local_e44;
  undefined1 local_e40 [32];
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  int local_da4;
  long local_da0;
  long local_d98;
  float *local_d70;
  undefined1 local_d60 [32];
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined1 local_ce0 [32];
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined1 local_c3b;
  undefined1 local_c3a;
  undefined1 local_c39;
  undefined1 (*local_c38) [32];
  undefined1 (*local_c30) [32];
  undefined1 (*local_c28) [32];
  undefined1 (*local_c20) [32];
  undefined1 (*local_c18) [32];
  undefined1 (*local_c10) [32];
  undefined1 (*local_c08) [32];
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined1 local_be0 [32];
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined1 local_b80 [32];
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined1 local_b40 [32];
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined1 local_b00 [32];
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined1 local_ac0 [32];
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined1 local_a80 [32];
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined1 local_a40 [32];
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined1 local_980 [32];
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined1 local_940 [32];
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined1 local_900 [32];
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined4 local_864;
  undefined1 local_860 [32];
  undefined4 local_824;
  undefined1 local_820 [32];
  undefined4 local_7e4;
  undefined1 local_7e0 [32];
  undefined4 local_7a4;
  undefined1 local_7a0 [32];
  undefined4 local_764;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined4 local_724;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined4 local_6e4;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined4 local_6a4;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined4 local_664;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined1 (*local_428) [16];
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined1 local_300 [32];
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined1 local_2c0 [32];
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [32];
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined1 local_240 [32];
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_18c;
  float *local_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  undefined1 local_e0;
  undefined1 local_df;
  undefined1 local_de;
  undefined1 local_dd;
  undefined1 local_dc;
  undefined1 local_db;
  undefined1 local_da;
  undefined1 local_d9;
  undefined1 local_d8;
  undefined1 local_d7;
  undefined1 local_d6;
  undefined1 local_d5;
  undefined1 local_d4;
  undefined1 local_d3;
  undefined1 local_d2;
  undefined1 local_d1;
  undefined1 local_d0;
  undefined1 local_cf;
  undefined1 local_ce;
  undefined1 local_cd;
  undefined1 local_cc;
  undefined1 local_cb;
  undefined1 local_ca;
  undefined1 local_c9;
  undefined1 local_c8;
  undefined1 local_c7;
  undefined1 local_c6;
  undefined1 local_c5;
  undefined1 local_c4;
  undefined1 local_c3;
  undefined1 local_c2;
  undefined1 local_c1;
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  undefined1 local_a0;
  undefined1 local_9f;
  undefined1 local_9e;
  undefined1 local_9d;
  undefined1 local_9c;
  undefined1 local_9b;
  undefined1 local_9a;
  undefined1 local_99;
  undefined1 local_98;
  undefined1 local_97;
  undefined1 local_96;
  undefined1 local_95;
  undefined1 local_94;
  undefined1 local_93;
  undefined1 local_92;
  undefined1 local_91;
  undefined1 local_90;
  undefined1 local_8f;
  undefined1 local_8e;
  undefined1 local_8d;
  undefined1 local_8c;
  undefined1 local_8b;
  undefined1 local_8a;
  undefined1 local_89;
  undefined1 local_88;
  undefined1 local_87;
  undefined1 local_86;
  undefined1 local_85;
  undefined1 local_84;
  undefined1 local_83;
  undefined1 local_82;
  undefined1 local_81;
  undefined1 local_80 [16];
  undefined1 auStack_70 [16];
  undefined1 local_50;
  undefined1 local_4f;
  undefined1 local_4e;
  undefined1 local_4d;
  undefined1 local_4c;
  undefined1 local_4b;
  undefined1 local_4a;
  undefined1 local_49;
  undefined1 local_48;
  undefined1 local_47;
  undefined1 local_46;
  undefined1 local_45;
  undefined1 local_44;
  undefined1 local_43;
  undefined1 local_42;
  undefined1 local_41;
  undefined1 local_40;
  undefined1 local_3f;
  undefined1 local_3e;
  undefined1 local_3d;
  undefined1 local_3c;
  undefined1 local_3b;
  undefined1 local_3a;
  undefined1 local_39;
  undefined1 local_38;
  undefined1 local_37;
  undefined1 local_36;
  undefined1 local_35;
  undefined1 local_34;
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31;
  
  if (in_EDI < 0) {
    in_EDI = in_EDI + 0xff;
  }
  local_da4 = in_EDI >> 8;
  local_c39 = 0xf;
  local_c1 = 0xf;
  local_c2 = 0xf;
  local_c3 = 0xf;
  local_c4 = 0xf;
  local_c5 = 0xf;
  local_c6 = 0xf;
  local_c7 = 0xf;
  local_c8 = 0xf;
  local_c9 = 0xf;
  local_ca = 0xf;
  local_cb = 0xf;
  local_cc = 0xf;
  local_cd = 0xf;
  local_ce = 0xf;
  local_cf = 0xf;
  local_d0 = 0xf;
  local_d1 = 0xf;
  local_d2 = 0xf;
  local_d3 = 0xf;
  local_d4 = 0xf;
  local_d5 = 0xf;
  local_d6 = 0xf;
  local_d7 = 0xf;
  local_d8 = 0xf;
  local_d9 = 0xf;
  local_da = 0xf;
  local_db = 0xf;
  local_dc = 0xf;
  local_dd = 0xf;
  local_de = 0xf;
  local_df = 0xf;
  local_e0 = 0xf;
  auVar1 = vpinsrb_avx(ZEXT116(0xf),0xf,1);
  auVar1 = vpinsrb_avx(auVar1,0xf,2);
  auVar1 = vpinsrb_avx(auVar1,0xf,3);
  auVar1 = vpinsrb_avx(auVar1,0xf,4);
  auVar1 = vpinsrb_avx(auVar1,0xf,5);
  auVar1 = vpinsrb_avx(auVar1,0xf,6);
  auVar1 = vpinsrb_avx(auVar1,0xf,7);
  auVar1 = vpinsrb_avx(auVar1,0xf,8);
  auVar1 = vpinsrb_avx(auVar1,0xf,9);
  auVar1 = vpinsrb_avx(auVar1,0xf,10);
  auVar1 = vpinsrb_avx(auVar1,0xf,0xb);
  auVar1 = vpinsrb_avx(auVar1,0xf,0xc);
  auVar1 = vpinsrb_avx(auVar1,0xf,0xd);
  auVar1 = vpinsrb_avx(auVar1,0xf,0xe);
  local_100 = vpinsrb_avx(auVar1,0xf,0xf);
  auVar1 = vpinsrb_avx(ZEXT116(0xf),0xf,1);
  auVar1 = vpinsrb_avx(auVar1,0xf,2);
  auVar1 = vpinsrb_avx(auVar1,0xf,3);
  auVar1 = vpinsrb_avx(auVar1,0xf,4);
  auVar1 = vpinsrb_avx(auVar1,0xf,5);
  auVar1 = vpinsrb_avx(auVar1,0xf,6);
  auVar1 = vpinsrb_avx(auVar1,0xf,7);
  auVar1 = vpinsrb_avx(auVar1,0xf,8);
  auVar1 = vpinsrb_avx(auVar1,0xf,9);
  auVar1 = vpinsrb_avx(auVar1,0xf,10);
  auVar1 = vpinsrb_avx(auVar1,0xf,0xb);
  auVar1 = vpinsrb_avx(auVar1,0xf,0xc);
  auVar1 = vpinsrb_avx(auVar1,0xf,0xd);
  auVar1 = vpinsrb_avx(auVar1,0xf,0xe);
  auStack_f0 = vpinsrb_avx(auVar1,0xf,0xf);
  local_de0 = local_100._0_8_;
  uStack_dd8 = local_100._8_8_;
  uStack_dd0 = auStack_f0._0_8_;
  uStack_dc8 = auStack_f0._8_8_;
  local_c3a = 3;
  local_81 = 3;
  local_82 = 3;
  local_83 = 3;
  local_84 = 3;
  local_85 = 3;
  local_86 = 3;
  local_87 = 3;
  local_88 = 3;
  local_89 = 3;
  local_8a = 3;
  local_8b = 3;
  local_8c = 3;
  local_8d = 3;
  local_8e = 3;
  local_8f = 3;
  local_90 = 3;
  local_91 = 3;
  local_92 = 3;
  local_93 = 3;
  local_94 = 3;
  local_95 = 3;
  local_96 = 3;
  local_97 = 3;
  local_98 = 3;
  local_99 = 3;
  local_9a = 3;
  local_9b = 3;
  local_9c = 3;
  local_9d = 3;
  local_9e = 3;
  local_9f = 3;
  local_a0 = 3;
  auVar1 = vpinsrb_avx(ZEXT116(3),3,1);
  auVar1 = vpinsrb_avx(auVar1,3,2);
  auVar1 = vpinsrb_avx(auVar1,3,3);
  auVar1 = vpinsrb_avx(auVar1,3,4);
  auVar1 = vpinsrb_avx(auVar1,3,5);
  auVar1 = vpinsrb_avx(auVar1,3,6);
  auVar1 = vpinsrb_avx(auVar1,3,7);
  auVar1 = vpinsrb_avx(auVar1,3,8);
  auVar1 = vpinsrb_avx(auVar1,3,9);
  auVar1 = vpinsrb_avx(auVar1,3,10);
  auVar1 = vpinsrb_avx(auVar1,3,0xb);
  auVar1 = vpinsrb_avx(auVar1,3,0xc);
  auVar1 = vpinsrb_avx(auVar1,3,0xd);
  auVar1 = vpinsrb_avx(auVar1,3,0xe);
  local_c0 = vpinsrb_avx(auVar1,3,0xf);
  auVar1 = vpinsrb_avx(ZEXT116(3),3,1);
  auVar1 = vpinsrb_avx(auVar1,3,2);
  auVar1 = vpinsrb_avx(auVar1,3,3);
  auVar1 = vpinsrb_avx(auVar1,3,4);
  auVar1 = vpinsrb_avx(auVar1,3,5);
  auVar1 = vpinsrb_avx(auVar1,3,6);
  auVar1 = vpinsrb_avx(auVar1,3,7);
  auVar1 = vpinsrb_avx(auVar1,3,8);
  auVar1 = vpinsrb_avx(auVar1,3,9);
  auVar1 = vpinsrb_avx(auVar1,3,10);
  auVar1 = vpinsrb_avx(auVar1,3,0xb);
  auVar1 = vpinsrb_avx(auVar1,3,0xc);
  auVar1 = vpinsrb_avx(auVar1,3,0xd);
  auVar1 = vpinsrb_avx(auVar1,3,0xe);
  auStack_b0 = vpinsrb_avx(auVar1,3,0xf);
  local_e00 = local_c0._0_8_;
  uStack_df8 = local_c0._8_8_;
  uStack_df0 = auStack_b0._0_8_;
  uStack_de8 = auStack_b0._8_8_;
  local_c3b = 0x20;
  local_31 = 0x20;
  local_32 = 0x20;
  local_33 = 0x20;
  local_34 = 0x20;
  local_35 = 0x20;
  local_36 = 0x20;
  local_37 = 0x20;
  local_38 = 0x20;
  local_39 = 0x20;
  local_3a = 0x20;
  local_3b = 0x20;
  local_3c = 0x20;
  local_3d = 0x20;
  local_3e = 0x20;
  local_3f = 0x20;
  local_40 = 0x20;
  local_41 = 0x20;
  local_42 = 0x20;
  local_43 = 0x20;
  local_44 = 0x20;
  local_45 = 0x20;
  local_46 = 0x20;
  local_47 = 0x20;
  local_48 = 0x20;
  local_49 = 0x20;
  local_4a = 0x20;
  local_4b = 0x20;
  local_4c = 0x20;
  local_4d = 0x20;
  local_4e = 0x20;
  local_4f = 0x20;
  local_50 = 0x20;
  auVar1 = vpinsrb_avx(ZEXT116(0x20),0x20,1);
  auVar1 = vpinsrb_avx(auVar1,0x20,2);
  auVar1 = vpinsrb_avx(auVar1,0x20,3);
  auVar1 = vpinsrb_avx(auVar1,0x20,4);
  auVar1 = vpinsrb_avx(auVar1,0x20,5);
  auVar1 = vpinsrb_avx(auVar1,0x20,6);
  auVar1 = vpinsrb_avx(auVar1,0x20,7);
  auVar1 = vpinsrb_avx(auVar1,0x20,8);
  auVar1 = vpinsrb_avx(auVar1,0x20,9);
  auVar1 = vpinsrb_avx(auVar1,0x20,10);
  auVar1 = vpinsrb_avx(auVar1,0x20,0xb);
  auVar1 = vpinsrb_avx(auVar1,0x20,0xc);
  auVar1 = vpinsrb_avx(auVar1,0x20,0xd);
  auVar1 = vpinsrb_avx(auVar1,0x20,0xe);
  local_80 = vpinsrb_avx(auVar1,0x20,0xf);
  auVar1 = vpinsrb_avx(ZEXT116(0x20),0x20,1);
  auVar1 = vpinsrb_avx(auVar1,0x20,2);
  auVar1 = vpinsrb_avx(auVar1,0x20,3);
  auVar1 = vpinsrb_avx(auVar1,0x20,4);
  auVar1 = vpinsrb_avx(auVar1,0x20,5);
  auVar1 = vpinsrb_avx(auVar1,0x20,6);
  auVar1 = vpinsrb_avx(auVar1,0x20,7);
  auVar1 = vpinsrb_avx(auVar1,0x20,8);
  auVar1 = vpinsrb_avx(auVar1,0x20,9);
  auVar1 = vpinsrb_avx(auVar1,0x20,10);
  auVar1 = vpinsrb_avx(auVar1,0x20,0xb);
  auVar1 = vpinsrb_avx(auVar1,0x20,0xc);
  auVar1 = vpinsrb_avx(auVar1,0x20,0xd);
  auVar1 = vpinsrb_avx(auVar1,0x20,0xe);
  auStack_70 = vpinsrb_avx(auVar1,0x20,0xf);
  local_e20 = local_80._0_8_;
  uStack_e18 = local_80._8_8_;
  uStack_e10 = auStack_70._0_8_;
  uStack_e08 = auStack_70._8_8_;
  local_c60 = 0;
  uStack_c58 = 0;
  uStack_c50 = 0;
  uStack_c48 = 0;
  local_e40._0_16_ = ZEXT816(0);
  local_da0 = in_R9;
  local_d98 = in_RCX;
  local_d70 = in_RSI;
  for (local_e44 = 0; local_e40 = ZEXT1632(local_e40._0_16_), local_e44 < local_da4;
      local_e44 = local_e44 + 1) {
    fVar24 = *(float *)(local_da0 + (long)local_e44 * 0x124);
    local_e48 = ggml_lookup_fp16_to_fp32
                          (*(ggml_fp16_t *)(local_d98 + 0xd0 + (long)local_e44 * 0xd2));
    local_e48 = fVar24 * local_e48;
    local_e50 = (undefined1 (*) [32])(local_d98 + (long)local_e44 * 0xd2);
    local_e58 = (undefined1 (*) [32])(local_d98 + 0x80 + (long)local_e44 * 0xd2);
    local_e60 = (undefined1 (*) [32])(local_da0 + 4 + (long)local_e44 * 0x124);
    local_428 = (undefined1 (*) [16])(local_d98 + 0xc0 + (long)local_e44 * 0xd2);
    uVar14 = *(undefined8 *)*local_428;
    uVar15 = *(undefined8 *)(*local_428 + 8);
    auVar1 = *local_428;
    local_8a0 = 0;
    uStack_898 = 0;
    uStack_890 = 0;
    uStack_888 = 0;
    local_ea0 = ZEXT1632(ZEXT816(0));
    local_ea4 = 0;
    for (local_ea8 = 0; local_ea8 < 2; local_ea8 = local_ea8 + 1) {
      uVar25 = uVar14;
      uVar27 = uVar15;
      in_stack_ffffffffffffedd8 = uVar15;
      get_scale_shuffle(local_ea4);
      auVar23._8_8_ = in_stack_ffffffffffffedd8;
      auVar23._0_8_ = uVar14;
      auVar2._8_8_ = uVar27;
      auVar2._0_8_ = uVar25;
      auVar2 = vpshufb_avx(auVar23,auVar2);
      uVar26 = uVar14;
      uVar28 = uVar15;
      in_stack_ffffffffffffede0 = uVar14;
      in_stack_ffffffffffffede8 = uVar15;
      local_120 = uVar25;
      uStack_118 = uVar27;
      local_110 = uVar14;
      uStack_108 = in_stack_ffffffffffffedd8;
      get_scale_shuffle(local_ea4 + 1);
      auVar22._8_8_ = in_stack_ffffffffffffede8;
      auVar22._0_8_ = in_stack_ffffffffffffede0;
      auVar3._8_8_ = uVar28;
      auVar3._0_8_ = uVar26;
      auVar3 = vpshufb_avx(auVar22,auVar3);
      uVar25 = uVar14;
      uVar27 = uVar15;
      in_stack_ffffffffffffedf0 = uVar14;
      local_140 = uVar26;
      uStack_138 = uVar28;
      local_130 = in_stack_ffffffffffffede0;
      uStack_128 = in_stack_ffffffffffffede8;
      get_scale_shuffle(local_ea4 + 2);
      auVar21._8_8_ = uVar15;
      auVar21._0_8_ = in_stack_ffffffffffffedf0;
      auVar4._8_8_ = uVar27;
      auVar4._0_8_ = uVar25;
      auVar4 = vpshufb_avx(auVar21,auVar4);
      uVar26 = uVar14;
      uVar28 = uVar15;
      local_160 = uVar25;
      uStack_158 = uVar27;
      local_150 = in_stack_ffffffffffffedf0;
      uStack_148 = uVar15;
      get_scale_shuffle(local_ea4 + 3);
      auVar5._8_8_ = uVar28;
      auVar5._0_8_ = uVar26;
      auVar5 = vpshufb_avx(auVar1,auVar5);
      local_ea4 = local_ea4 + 4;
      local_c08 = local_e50;
      local_9c0 = *(undefined8 *)*local_e50;
      uStack_9b8 = *(undefined8 *)(*local_e50 + 8);
      uStack_9b0 = *(undefined8 *)(*local_e50 + 0x10);
      uStack_9a8 = *(undefined8 *)(*local_e50 + 0x18);
      auVar8 = *local_e50;
      auVar7 = *local_e50;
      local_c10 = local_e50 + 1;
      local_a00 = *(undefined8 *)*local_c10;
      uStack_9f8 = *(undefined8 *)(local_e50[1] + 8);
      uStack_9f0 = *(undefined8 *)(local_e50[1] + 0x10);
      uStack_9e8 = *(undefined8 *)(local_e50[1] + 0x18);
      local_e50 = local_e50 + 2;
      local_c18 = local_e58;
      local_8c0 = *(undefined8 *)*local_e58;
      uStack_8b8 = *(undefined8 *)(*local_e58 + 8);
      uStack_8b0 = *(undefined8 *)(*local_e58 + 0x10);
      uStack_8a8 = *(undefined8 *)(*local_e58 + 0x18);
      auVar13 = *local_e58;
      auVar12 = *local_e58;
      auVar11 = *local_e58;
      auVar10 = *local_e58;
      local_e58 = local_e58 + 1;
      local_8e0 = local_e00;
      uStack_8d8 = uStack_df8;
      uStack_8d0 = uStack_df0;
      uStack_8c8 = uStack_de8;
      auVar16._8_8_ = uStack_df8;
      auVar16._0_8_ = local_e00;
      auVar16._16_8_ = uStack_df0;
      auVar16._24_8_ = uStack_de8;
      local_7a0 = vpand_avx2(auVar10,auVar16);
      local_7a4 = 4;
      auVar10 = vpsllw_avx2(local_7a0,ZEXT416(4));
      local_664 = 2;
      local_900 = vpsrlw_avx2(auVar11,ZEXT416(2));
      local_920 = local_e00;
      uStack_918 = uStack_df8;
      uStack_910 = uStack_df0;
      uStack_908 = uStack_de8;
      auVar9._8_8_ = uStack_df8;
      auVar9._0_8_ = local_e00;
      auVar9._16_8_ = uStack_df0;
      auVar9._24_8_ = uStack_de8;
      local_7e0 = vpand_avx2(local_900,auVar9);
      local_7e4 = 4;
      auVar11 = vpsllw_avx2(local_7e0,ZEXT416(4));
      local_6a4 = 4;
      local_940 = vpsrlw_avx2(auVar12,ZEXT416(4));
      local_960 = local_e00;
      uStack_958 = uStack_df8;
      uStack_950 = uStack_df0;
      uStack_948 = uStack_de8;
      auVar12._8_8_ = uStack_df8;
      auVar12._0_8_ = local_e00;
      auVar12._16_8_ = uStack_df0;
      auVar12._24_8_ = uStack_de8;
      local_820 = vpand_avx2(local_940,auVar12);
      local_824 = 4;
      auVar12 = vpsllw_avx2(local_820,ZEXT416(4));
      local_6e4 = 6;
      local_980 = vpsrlw_avx2(auVar13,ZEXT416(6));
      local_9a0 = local_e00;
      uStack_998 = uStack_df8;
      uStack_990 = uStack_df0;
      uStack_988 = uStack_de8;
      auVar13._8_8_ = uStack_df8;
      auVar13._0_8_ = local_e00;
      auVar13._16_8_ = uStack_df0;
      auVar13._24_8_ = uStack_de8;
      local_860 = vpand_avx2(local_980,auVar13);
      local_864 = 4;
      auVar13 = vpsllw_avx2(local_860,ZEXT416(4));
      local_9e0 = local_de0;
      uStack_9d8 = uStack_dd8;
      uStack_9d0 = uStack_dd0;
      uStack_9c8 = uStack_dc8;
      auVar6._8_8_ = uStack_dd8;
      auVar6._0_8_ = local_de0;
      auVar6._16_8_ = uStack_dd0;
      auVar6._24_8_ = uStack_dc8;
      local_ac0 = vpand_avx2(auVar7,auVar6);
      local_f80 = auVar10._0_8_;
      local_ae0 = local_f80;
      uStack_f78 = auVar10._8_8_;
      uStack_ad8 = uStack_f78;
      uStack_f70 = auVar10._16_8_;
      uStack_ad0 = uStack_f70;
      uStack_f68 = auVar10._24_8_;
      uStack_ac8 = uStack_f68;
      auVar6 = vpor_avx2(local_ac0,auVar10);
      local_a20 = local_de0;
      uStack_a18 = uStack_dd8;
      uStack_a10 = uStack_dd0;
      uStack_a08 = uStack_dc8;
      auVar7._8_8_ = uStack_dd8;
      auVar7._0_8_ = local_de0;
      auVar7._16_8_ = uStack_dd0;
      auVar7._24_8_ = uStack_dc8;
      local_b00 = vpand_avx2(*local_c10,auVar7);
      local_fa0 = auVar11._0_8_;
      local_b20 = local_fa0;
      uStack_f98 = auVar11._8_8_;
      uStack_b18 = uStack_f98;
      uStack_f90 = auVar11._16_8_;
      uStack_b10 = uStack_f90;
      uStack_f88 = auVar11._24_8_;
      uStack_b08 = uStack_f88;
      auVar7 = vpor_avx2(local_b00,auVar11);
      local_724 = 4;
      local_a40 = vpsrlw_avx2(auVar8,ZEXT416(4));
      local_a60 = local_de0;
      uStack_a58 = uStack_dd8;
      uStack_a50 = uStack_dd0;
      uStack_a48 = uStack_dc8;
      auVar8._8_8_ = uStack_dd8;
      auVar8._0_8_ = local_de0;
      auVar8._16_8_ = uStack_dd0;
      auVar8._24_8_ = uStack_dc8;
      local_b40 = vpand_avx2(local_a40,auVar8);
      local_fc0 = auVar12._0_8_;
      local_b60 = local_fc0;
      uStack_fb8 = auVar12._8_8_;
      uStack_b58 = uStack_fb8;
      uStack_fb0 = auVar12._16_8_;
      uStack_b50 = uStack_fb0;
      uStack_fa8 = auVar12._24_8_;
      uStack_b48 = uStack_fa8;
      auVar8 = vpor_avx2(local_b40,auVar12);
      local_764 = 4;
      local_a80 = vpsrlw_avx2(*local_c10,ZEXT416(4));
      local_aa0 = local_de0;
      uStack_a98 = uStack_dd8;
      uStack_a90 = uStack_dd0;
      uStack_a88 = uStack_dc8;
      auVar11._8_8_ = uStack_dd8;
      auVar11._0_8_ = local_de0;
      auVar11._16_8_ = uStack_dd0;
      auVar11._24_8_ = uStack_dc8;
      local_b80 = vpand_avx2(local_a80,auVar11);
      local_fe0 = auVar13._0_8_;
      local_ba0 = local_fe0;
      uStack_fd8 = auVar13._8_8_;
      uStack_b98 = uStack_fd8;
      uStack_fd0 = auVar13._16_8_;
      uStack_b90 = uStack_fd0;
      uStack_fc8 = auVar13._24_8_;
      uStack_b88 = uStack_fc8;
      auVar9 = vpor_avx2(local_b80,auVar13);
      local_c20 = local_e60;
      local_580 = *(undefined8 *)*local_e60;
      uStack_578 = *(undefined8 *)(*local_e60 + 8);
      uStack_570 = *(undefined8 *)(*local_e60 + 0x10);
      uStack_568 = *(undefined8 *)(*local_e60 + 0x18);
      auVar16 = *local_e60;
      auVar10 = *local_e60;
      local_c28 = local_e60 + 1;
      local_5c0 = *(undefined8 *)*local_c28;
      uStack_5b8 = *(undefined8 *)(local_e60[1] + 8);
      uStack_5b0 = *(undefined8 *)(local_e60[1] + 0x10);
      uStack_5a8 = *(undefined8 *)(local_e60[1] + 0x18);
      local_c30 = local_e60 + 2;
      local_600 = *(undefined8 *)*local_c30;
      uStack_5f8 = *(undefined8 *)(local_e60[2] + 8);
      uStack_5f0 = *(undefined8 *)(local_e60[2] + 0x10);
      uStack_5e8 = *(undefined8 *)(local_e60[2] + 0x18);
      local_c38 = local_e60 + 3;
      local_640 = *(undefined8 *)*local_c38;
      uStack_638 = *(undefined8 *)(local_e60[3] + 8);
      uStack_630 = *(undefined8 *)(local_e60[3] + 0x10);
      uStack_628 = *(undefined8 *)(local_e60[3] + 0x18);
      local_e60 = local_e60 + 4;
      local_460 = local_e20;
      uStack_458 = uStack_e18;
      uStack_450 = uStack_e10;
      uStack_448 = uStack_e08;
      auVar20._8_8_ = uStack_e18;
      auVar20._0_8_ = local_e20;
      auVar20._16_8_ = uStack_e10;
      auVar20._24_8_ = uStack_e08;
      auVar10 = vpmaddubsw_avx2(auVar20,auVar10);
      local_4a0 = local_e20;
      uStack_498 = uStack_e18;
      uStack_490 = uStack_e10;
      uStack_488 = uStack_e08;
      auVar19._8_8_ = uStack_e18;
      auVar19._0_8_ = local_e20;
      auVar19._16_8_ = uStack_e10;
      auVar19._24_8_ = uStack_e08;
      auVar11 = vpmaddubsw_avx2(auVar19,*local_c28);
      local_4e0 = local_e20;
      uStack_4d8 = uStack_e18;
      uStack_4d0 = uStack_e10;
      uStack_4c8 = uStack_e08;
      auVar18._8_8_ = uStack_e18;
      auVar18._0_8_ = local_e20;
      auVar18._16_8_ = uStack_e10;
      auVar18._24_8_ = uStack_e08;
      auVar12 = vpmaddubsw_avx2(auVar18,*local_c30);
      local_520 = local_e20;
      uStack_518 = uStack_e18;
      uStack_510 = uStack_e10;
      uStack_508 = uStack_e08;
      auVar17._8_8_ = uStack_e18;
      auVar17._0_8_ = local_e20;
      auVar17._16_8_ = uStack_e10;
      auVar17._24_8_ = uStack_e08;
      auVar13 = vpmaddubsw_avx2(auVar17,*local_c38);
      local_1000 = auVar6._0_8_;
      local_560 = local_1000;
      uStack_ff8 = auVar6._8_8_;
      uStack_558 = uStack_ff8;
      uStack_ff0 = auVar6._16_8_;
      uStack_550 = uStack_ff0;
      uStack_fe8 = auVar6._24_8_;
      uStack_548 = uStack_fe8;
      auVar6 = vpmaddubsw_avx2(auVar6,auVar16);
      local_1020 = auVar7._0_8_;
      local_5a0 = local_1020;
      uStack_1018 = auVar7._8_8_;
      uStack_598 = uStack_1018;
      uStack_1010 = auVar7._16_8_;
      uStack_590 = uStack_1010;
      uStack_1008 = auVar7._24_8_;
      uStack_588 = uStack_1008;
      auVar7 = vpmaddubsw_avx2(auVar7,*local_c28);
      local_1040 = auVar8._0_8_;
      local_5e0 = local_1040;
      uStack_1038 = auVar8._8_8_;
      uStack_5d8 = uStack_1038;
      uStack_1030 = auVar8._16_8_;
      uStack_5d0 = uStack_1030;
      uStack_1028 = auVar8._24_8_;
      uStack_5c8 = uStack_1028;
      auVar8 = vpmaddubsw_avx2(auVar8,*local_c30);
      local_1060 = auVar9._0_8_;
      local_620 = local_1060;
      uStack_1058 = auVar9._8_8_;
      uStack_618 = uStack_1058;
      uStack_1050 = auVar9._16_8_;
      uStack_610 = uStack_1050;
      uStack_1048 = auVar9._24_8_;
      uStack_608 = uStack_1048;
      auVar9 = vpmaddubsw_avx2(auVar9,*local_c38);
      local_1180 = auVar6._0_8_;
      local_340 = local_1180;
      uStack_1178 = auVar6._8_8_;
      uStack_338 = uStack_1178;
      uStack_1170 = auVar6._16_8_;
      uStack_330 = uStack_1170;
      uStack_1168 = auVar6._24_8_;
      uStack_328 = uStack_1168;
      local_1100 = auVar10._0_8_;
      local_360 = local_1100;
      uStack_10f8 = auVar10._8_8_;
      uStack_358 = uStack_10f8;
      uStack_10f0 = auVar10._16_8_;
      uStack_350 = uStack_10f0;
      uStack_10e8 = auVar10._24_8_;
      uStack_348 = uStack_10e8;
      auVar10 = vpsubw_avx2(auVar6,auVar10);
      local_11a0 = auVar7._0_8_;
      local_380 = local_11a0;
      uStack_1198 = auVar7._8_8_;
      uStack_378 = uStack_1198;
      uStack_1190 = auVar7._16_8_;
      uStack_370 = uStack_1190;
      uStack_1188 = auVar7._24_8_;
      uStack_368 = uStack_1188;
      local_1120 = auVar11._0_8_;
      local_3a0 = local_1120;
      uStack_1118 = auVar11._8_8_;
      uStack_398 = uStack_1118;
      uStack_1110 = auVar11._16_8_;
      uStack_390 = uStack_1110;
      uStack_1108 = auVar11._24_8_;
      uStack_388 = uStack_1108;
      auVar11 = vpsubw_avx2(auVar7,auVar11);
      local_11c0 = auVar8._0_8_;
      local_3c0 = local_11c0;
      uStack_11b8 = auVar8._8_8_;
      uStack_3b8 = uStack_11b8;
      uStack_11b0 = auVar8._16_8_;
      uStack_3b0 = uStack_11b0;
      uStack_11a8 = auVar8._24_8_;
      uStack_3a8 = uStack_11a8;
      local_1140 = auVar12._0_8_;
      local_3e0 = local_1140;
      uStack_1138 = auVar12._8_8_;
      uStack_3d8 = uStack_1138;
      uStack_1130 = auVar12._16_8_;
      uStack_3d0 = uStack_1130;
      uStack_1128 = auVar12._24_8_;
      uStack_3c8 = uStack_1128;
      auVar12 = vpsubw_avx2(auVar8,auVar12);
      local_11e0 = auVar9._0_8_;
      local_400 = local_11e0;
      uStack_11d8 = auVar9._8_8_;
      uStack_3f8 = uStack_11d8;
      uStack_11d0 = auVar9._16_8_;
      uStack_3f0 = uStack_11d0;
      uStack_11c8 = auVar9._24_8_;
      uStack_3e8 = uStack_11c8;
      local_1160 = auVar13._0_8_;
      local_420 = local_1160;
      uStack_1158 = auVar13._8_8_;
      uStack_418 = uStack_1158;
      uStack_1150 = auVar13._16_8_;
      uStack_410 = uStack_1150;
      uStack_1148 = auVar13._24_8_;
      uStack_408 = uStack_1148;
      auVar13 = vpsubw_avx2(auVar9,auVar13);
      local_ec0 = auVar2._0_8_;
      local_1d0 = local_ec0;
      uStack_eb8 = auVar2._8_8_;
      uStack_1c8 = uStack_eb8;
      local_240 = vpmovsxbw_avx2(auVar2);
      local_1180 = auVar10._0_8_;
      local_260 = local_1180;
      uStack_1178 = auVar10._8_8_;
      uStack_258 = uStack_1178;
      uStack_1170 = auVar10._16_8_;
      uStack_250 = uStack_1170;
      uStack_1168 = auVar10._24_8_;
      uStack_248 = uStack_1168;
      auVar10 = vpmaddwd_avx2(local_240,auVar10);
      local_ed0 = auVar3._0_8_;
      local_1e0 = local_ed0;
      uStack_ec8 = auVar3._8_8_;
      uStack_1d8 = uStack_ec8;
      local_280 = vpmovsxbw_avx2(auVar3);
      local_11a0 = auVar11._0_8_;
      local_2a0 = local_11a0;
      uStack_1198 = auVar11._8_8_;
      uStack_298 = uStack_1198;
      uStack_1190 = auVar11._16_8_;
      uStack_290 = uStack_1190;
      uStack_1188 = auVar11._24_8_;
      uStack_288 = uStack_1188;
      auVar11 = vpmaddwd_avx2(local_280,auVar11);
      local_ee0 = auVar4._0_8_;
      local_1f0 = local_ee0;
      uStack_ed8 = auVar4._8_8_;
      uStack_1e8 = uStack_ed8;
      local_2c0 = vpmovsxbw_avx2(auVar4);
      local_11c0 = auVar12._0_8_;
      local_2e0 = local_11c0;
      uStack_11b8 = auVar12._8_8_;
      uStack_2d8 = uStack_11b8;
      uStack_11b0 = auVar12._16_8_;
      uStack_2d0 = uStack_11b0;
      uStack_11a8 = auVar12._24_8_;
      uStack_2c8 = uStack_11a8;
      auVar12 = vpmaddwd_avx2(local_2c0,auVar12);
      local_ef0 = auVar5._0_8_;
      local_200 = local_ef0;
      uStack_ee8 = auVar5._8_8_;
      uStack_1f8 = uStack_ee8;
      local_300 = vpmovsxbw_avx2(auVar5);
      local_11e0 = auVar13._0_8_;
      local_320 = local_11e0;
      uStack_11d8 = auVar13._8_8_;
      uStack_318 = uStack_11d8;
      uStack_11d0 = auVar13._16_8_;
      uStack_310 = uStack_11d0;
      uStack_11c8 = auVar13._24_8_;
      uStack_308 = uStack_11c8;
      auVar13 = vpmaddwd_avx2(local_300,auVar13);
      local_cc0 = local_ea0._0_8_;
      uStack_cb8 = local_ea0._8_8_;
      uStack_cb0 = local_ea0._16_8_;
      uStack_ca8 = local_ea0._24_8_;
      local_1180 = auVar10._0_8_;
      local_c80 = local_1180;
      uStack_1178 = auVar10._8_8_;
      uStack_c78 = uStack_1178;
      uStack_1170 = auVar10._16_8_;
      uStack_c70 = uStack_1170;
      uStack_1168 = auVar10._24_8_;
      uStack_c68 = uStack_1168;
      local_11a0 = auVar11._0_8_;
      local_ca0 = local_11a0;
      uStack_1198 = auVar11._8_8_;
      uStack_c98 = uStack_1198;
      uStack_1190 = auVar11._16_8_;
      uStack_c90 = uStack_1190;
      uStack_1188 = auVar11._24_8_;
      uStack_c88 = uStack_1188;
      local_ce0 = vpaddd_avx2(auVar10,auVar11);
      auVar10 = vpaddd_avx2(local_ea0,local_ce0);
      local_ea0._0_8_ = auVar10._0_8_;
      local_d40 = local_ea0._0_8_;
      local_ea0._8_8_ = auVar10._8_8_;
      uStack_d38 = local_ea0._8_8_;
      local_ea0._16_8_ = auVar10._16_8_;
      uStack_d30 = local_ea0._16_8_;
      local_ea0._24_8_ = auVar10._24_8_;
      uStack_d28 = local_ea0._24_8_;
      local_11c0 = auVar12._0_8_;
      local_d00 = local_11c0;
      uStack_11b8 = auVar12._8_8_;
      uStack_cf8 = uStack_11b8;
      uStack_11b0 = auVar12._16_8_;
      uStack_cf0 = uStack_11b0;
      uStack_11a8 = auVar12._24_8_;
      uStack_ce8 = uStack_11a8;
      local_11e0 = auVar13._0_8_;
      local_d20 = local_11e0;
      uStack_11d8 = auVar13._8_8_;
      uStack_d18 = uStack_11d8;
      uStack_11d0 = auVar13._16_8_;
      uStack_d10 = uStack_11d0;
      uStack_11c8 = auVar13._24_8_;
      uStack_d08 = uStack_11c8;
      local_d60 = vpaddd_avx2(auVar12,auVar13);
      local_ea0 = vpaddd_avx2(auVar10,local_d60);
      local_760 = local_a00;
      uStack_758 = uStack_9f8;
      uStack_750 = uStack_9f0;
      uStack_748 = uStack_9e8;
      local_720 = local_9c0;
      uStack_718 = uStack_9b8;
      uStack_710 = uStack_9b0;
      uStack_708 = uStack_9a8;
      local_6e0 = local_8c0;
      uStack_6d8 = uStack_8b8;
      uStack_6d0 = uStack_8b0;
      uStack_6c8 = uStack_8a8;
      local_6a0 = local_8c0;
      uStack_698 = uStack_8b8;
      uStack_690 = uStack_8b0;
      uStack_688 = uStack_8a8;
      local_660 = local_8c0;
      uStack_658 = uStack_8b8;
      uStack_650 = uStack_8b0;
      uStack_648 = uStack_8a8;
      local_540 = local_640;
      uStack_538 = uStack_638;
      uStack_530 = uStack_630;
      uStack_528 = uStack_628;
      local_500 = local_600;
      uStack_4f8 = uStack_5f8;
      uStack_4f0 = uStack_5f0;
      uStack_4e8 = uStack_5e8;
      local_4c0 = local_5c0;
      uStack_4b8 = uStack_5b8;
      uStack_4b0 = uStack_5b0;
      uStack_4a8 = uStack_5a8;
      local_480 = local_580;
      uStack_478 = uStack_578;
      uStack_470 = uStack_570;
      uStack_468 = uStack_568;
      local_180 = uVar26;
      uStack_178 = uVar28;
      local_170 = uVar14;
      uStack_168 = uVar15;
    }
    local_188 = &local_e48;
    local_1c0 = local_e48;
    local_bc0 = CONCAT44(local_e48,local_e48);
    uStack_bb8 = CONCAT44(local_e48,local_e48);
    uStack_bb0 = CONCAT44(local_e48,local_e48);
    uStack_ba8 = CONCAT44(local_e48,local_e48);
    local_220 = local_ea0._0_8_;
    uStack_218 = local_ea0._8_8_;
    uStack_210 = local_ea0._16_8_;
    uStack_208 = local_ea0._24_8_;
    local_be0 = vcvtdq2ps_avx(local_ea0);
    local_c00 = local_e40._0_8_;
    uStack_bf8 = local_e40._8_8_;
    uStack_bf0 = local_e40._16_8_;
    uStack_be8 = local_e40._24_8_;
    auVar10._8_8_ = uStack_bb8;
    auVar10._0_8_ = local_bc0;
    auVar10._16_8_ = uStack_bb0;
    auVar10._24_8_ = uStack_ba8;
    local_e40._0_16_ = vfmadd213ps_fma(local_be0,auVar10,local_e40);
    fStack_1bc = local_1c0;
    fStack_1b8 = local_1c0;
    fStack_1b4 = local_1c0;
    fStack_1b0 = local_1c0;
    fStack_1ac = local_1c0;
    fStack_1a8 = local_1c0;
    fStack_1a4 = local_1c0;
    local_18c = local_1c0;
  }
  x_00[2] = (float)(int)in_stack_ffffffffffffede0;
  x_00[3] = (float)(int)((ulong)in_stack_ffffffffffffede0 >> 0x20);
  x_00[0] = (float)(int)in_stack_ffffffffffffedd8;
  x_00[1] = (float)(int)((ulong)in_stack_ffffffffffffedd8 >> 0x20);
  x_00[4] = (float)(int)in_stack_ffffffffffffede8;
  x_00[5] = (float)(int)((ulong)in_stack_ffffffffffffede8 >> 0x20);
  x_00[6] = (float)(int)in_stack_ffffffffffffedf0;
  x_00[7] = (float)(int)((ulong)in_stack_ffffffffffffedf0 >> 0x20);
  fVar24 = hsum_float_8(x_00);
  *local_d70 = fVar24;
  return;
}

Assistant:

void ggml_vec_dot_q6_K_q8_K(int n, float * GGML_RESTRICT s, size_t bs, const void * GGML_RESTRICT vx, size_t bx, const void * GGML_RESTRICT vy, size_t by, int nrc) {
    assert(n % QK_K == 0);
    assert(nrc == 1);
    UNUSED(nrc);
    UNUSED(bx);
    UNUSED(by);
    UNUSED(bs);

    const block_q6_K * GGML_RESTRICT x = vx;
    const block_q8_K * GGML_RESTRICT y = vy;

    const int nb = n / QK_K;

#ifdef __ARM_FEATURE_SVE
    const int vector_length = ggml_cpu_get_sve_cnt()*8;
    float sum = 0;
    svuint8_t m4b = svdup_n_u8(0xf);
    svint32_t vzero = svdup_n_s32(0);
    svuint8_t mone = svdup_n_u8(0x30);
    svint8_t q6bytes_1, q6bytes_2, q6bytes_3, q6bytes_4;
    svuint8_t q6h_1, q6h_2, q6h_3, q6h_4;

    for (int i = 0; i < nb; ++i) {
        const float d_all = GGML_FP16_TO_FP32(x[i].d);

        const uint8_t * GGML_RESTRICT q6 = x[i].ql;
        const uint8_t * GGML_RESTRICT qh = x[i].qh;
        const int8_t  * GGML_RESTRICT q8 = y[i].qs;

        const int8_t * GGML_RESTRICT scale = x[i].scales;

        const svbool_t pg16_8 = svptrue_pat_b16(SV_VL8);
        const svint16_t q8sums_1 = svld1_s16(pg16_8, y[i].bsums);
        const svint16_t q8sums_2 = svld1_s16(pg16_8, y[i].bsums + 8);
        const svint16_t q6scales_1 = svunpklo_s16(svld1_s8(svptrue_pat_b8(SV_VL8), scale));
        const svint16_t q6scales_2 = svunpklo_s16(svld1_s8(svptrue_pat_b8(SV_VL8), scale + 8));
        const svint64_t prod = svdup_n_s64(0);
        int32_t isum_mins = svaddv_s64(svptrue_b64(), svadd_s64_x(svptrue_b64(), svdot_s64(prod, q8sums_1, q6scales_1),
                                                                                 svdot_s64(prod, q8sums_2, q6scales_2)));
        int32_t isum = 0;

        switch (vector_length) {
            case 128:
                {
                    const svbool_t pg32_4 = svptrue_pat_b32(SV_VL4);
                    const svbool_t pg8_16 = svptrue_pat_b8(SV_VL16);
                    svint32_t isum_tmp = svdup_n_s32(0);
                    for (int j = 0; j < QK_K/128; ++j) {
                        svuint8_t qhbits_1 = svld1_u8(pg8_16, qh);
                        svuint8_t qhbits_2 = svld1_u8(pg8_16, qh+16);
                        qh += 32;
                        svuint8_t q6bits_1 = svld1_u8(pg8_16, q6);
                        svuint8_t q6bits_2 = svld1_u8(pg8_16, q6+16);
                        svuint8_t q6bits_3 = svld1_u8(pg8_16, q6+32);
                        svuint8_t q6bits_4 = svld1_u8(pg8_16, q6+48);
                        q6 += 64;
                        svint8_t q8bytes_1 = svld1_s8(pg8_16, q8);
                        svint8_t q8bytes_2 = svld1_s8(pg8_16, q8+16);
                        svint8_t q8bytes_3 = svld1_s8(pg8_16, q8+32);
                        svint8_t q8bytes_4 = svld1_s8(pg8_16, q8+48);
                        q8 += 64;

                        q6h_1 = svand_u8_x(pg16_8, mone, svlsl_n_u8_x(pg16_8, qhbits_1, 4));
                        q6h_2 = svand_u8_x(pg16_8, mone, svlsl_n_u8_x(pg16_8, qhbits_2, 4));
                        q6h_3 = svand_u8_x(pg16_8, mone, svlsl_n_u8_x(pg16_8, qhbits_1, 2));
                        q6h_4 = svand_u8_x(pg16_8, mone, svlsl_n_u8_x(pg16_8, qhbits_2, 2));
                        q6bytes_1 = svreinterpret_s8_u8(svorr_u8_x(pg8_16, svand_u8_x(pg8_16, q6bits_1, m4b), q6h_1));
                        q6bytes_2 = svreinterpret_s8_u8(svorr_u8_x(pg8_16, svand_u8_x(pg8_16, q6bits_2, m4b), q6h_2));
                        q6bytes_3 = svreinterpret_s8_u8(svorr_u8_x(pg8_16, svand_u8_x(pg8_16, q6bits_3, m4b), q6h_3));
                        q6bytes_4 = svreinterpret_s8_u8(svorr_u8_x(pg8_16, svand_u8_x(pg8_16, q6bits_4, m4b), q6h_4));
                        isum_tmp = svmla_n_s32_x(pg32_4, isum_tmp, svdot_s32(vzero, q6bytes_1, q8bytes_1), scale[0]);
                        isum_tmp = svmla_n_s32_x(pg32_4, isum_tmp, svdot_s32(vzero, q6bytes_2, q8bytes_2), scale[1]);
                        isum_tmp = svmla_n_s32_x(pg32_4, isum_tmp, svdot_s32(vzero, q6bytes_3, q8bytes_3), scale[2]);
                        isum_tmp = svmla_n_s32_x(pg32_4, isum_tmp, svdot_s32(vzero, q6bytes_4, q8bytes_4), scale[3]);

                        scale += 4;
                        q8bytes_1 = svld1_s8(pg8_16, q8);
                        q8bytes_2 = svld1_s8(pg8_16, q8+16);
                        q8bytes_3 = svld1_s8(pg8_16, q8+32);
                        q8bytes_4 = svld1_s8(pg8_16, q8+48);
                        q8 += 64;

                        q6h_1 = svand_u8_x(pg16_8, mone, qhbits_1);
                        q6h_2 = svand_u8_x(pg16_8, mone, qhbits_2);
                        q6h_3 = svand_u8_x(pg16_8, mone, svlsr_n_u8_x(pg16_8, qhbits_1, 2));
                        q6h_4 = svand_u8_x(pg16_8, mone, svlsr_n_u8_x(pg16_8, qhbits_2, 2));
                        q6bytes_1 = svreinterpret_s8_u8(svorr_u8_x(pg8_16, svlsr_n_u8_x(pg8_16, q6bits_1, 4), q6h_1));
                        q6bytes_2 = svreinterpret_s8_u8(svorr_u8_x(pg8_16, svlsr_n_u8_x(pg8_16, q6bits_2, 4), q6h_2));
                        q6bytes_3 = svreinterpret_s8_u8(svorr_u8_x(pg8_16, svlsr_n_u8_x(pg8_16, q6bits_3, 4), q6h_3));
                        q6bytes_4 = svreinterpret_s8_u8(svorr_u8_x(pg8_16, svlsr_n_u8_x(pg8_16, q6bits_4, 4), q6h_4));
                        isum_tmp = svmla_n_s32_x(pg32_4, isum_tmp, svdot_s32(vzero, q6bytes_1, q8bytes_1), scale[0]);
                        isum_tmp = svmla_n_s32_x(pg32_4, isum_tmp, svdot_s32(vzero, q6bytes_2, q8bytes_2), scale[1]);
                        isum_tmp = svmla_n_s32_x(pg32_4, isum_tmp, svdot_s32(vzero, q6bytes_3, q8bytes_3), scale[2]);
                        isum_tmp = svmla_n_s32_x(pg32_4, isum_tmp, svdot_s32(vzero, q6bytes_4, q8bytes_4), scale[3]);
                        scale += 4;
                    }
                    isum += svaddv_s32(pg32_4, isum_tmp);
                    sum += d_all * y[i].d * (isum - 32 * isum_mins);
                }
                break;
            case 256:
            case 512:
                {
                    const svbool_t pg8_2 = svptrue_pat_b8(SV_VL2);
                    const svbool_t pg32_8 = svptrue_pat_b32(SV_VL8);
                    const svbool_t pg8_32 = svptrue_pat_b8(SV_VL32);
                    svint32_t isum_tmp = svdup_n_s32(0);
                    for (int j = 0; j < QK_K/128; j++) {
                        svuint8_t qhbits_1 = svld1_u8(pg8_32, qh);
                        qh += 32;
                        svuint8_t q6bits_1 = svld1_u8(pg8_32, q6);
                        svuint8_t q6bits_2 = svld1_u8(pg8_32, q6+32);
                        q6 += 64;
                        svint8_t q8bytes_1 = svld1_s8(pg8_32, q8);
                        svint8_t q8bytes_2 = svld1_s8(pg8_32, q8+32);
                        svint8_t q8bytes_3 = svld1_s8(pg8_32, q8+64);
                        svint8_t q8bytes_4 = svld1_s8(pg8_32, q8+96);
                        q8 += 128;
                        q6h_1 = svand_u8_x(pg8_32, mone, svlsl_n_u8_x(pg8_32, qhbits_1, 4));
                        q6h_2 = svand_u8_x(pg8_32, mone, svlsl_n_u8_x(pg8_32, qhbits_1, 2));
                        q6h_3 = svand_u8_x(pg8_32, mone, qhbits_1);
                        q6h_4 = svand_u8_x(pg8_32, mone, svlsr_n_u8_x(pg8_32, qhbits_1, 2));
                        q6bytes_1 = svreinterpret_s8_u8(svorr_u8_x(pg8_32, svand_u8_x(pg8_32, q6bits_1, m4b), q6h_1));
                        q6bytes_2 = svreinterpret_s8_u8(svorr_u8_x(pg8_32, svand_u8_x(pg8_32, q6bits_2, m4b), q6h_2));
                        q6bytes_3 = svreinterpret_s8_u8(svorr_u8_x(pg8_32, svlsr_n_u8_x(pg8_32, q6bits_1, 4), q6h_3));
                        q6bytes_4 = svreinterpret_s8_u8(svorr_u8_x(pg8_32, svlsr_n_u8_x(pg8_32, q6bits_2, 4), q6h_4));

                        svint8_t scale_lane_1_tmp = svld1_s8(pg8_2, scale);
                        scale_lane_1_tmp= svzip1_s8(scale_lane_1_tmp, scale_lane_1_tmp);
                        scale_lane_1_tmp= svzip1_s8(scale_lane_1_tmp, scale_lane_1_tmp);
                        svint8_t scale_lane_2_tmp = svld1_s8(pg8_2, scale+2);
                        scale_lane_2_tmp = svzip1_s8(scale_lane_2_tmp, scale_lane_2_tmp);
                        scale_lane_2_tmp = svzip1_s8(scale_lane_2_tmp, scale_lane_2_tmp);
                        svint8_t scale_lane_3_tmp = svld1_s8(pg8_2, scale+4);
                        scale_lane_3_tmp = svzip1_s8(scale_lane_3_tmp, scale_lane_3_tmp);
                        scale_lane_3_tmp = svzip1_s8(scale_lane_3_tmp, scale_lane_3_tmp);
                        svint8_t scale_lane_4_tmp = svld1_s8(pg8_2, scale+6);
                        scale_lane_4_tmp = svzip1_s8(scale_lane_4_tmp, scale_lane_4_tmp);
                        scale_lane_4_tmp = svzip1_s8(scale_lane_4_tmp, scale_lane_4_tmp);
                        svint32_t scale_lane_1 = svunpklo_s32(svunpklo_s16(scale_lane_1_tmp));
                        svint32_t scale_lane_2 = svunpklo_s32(svunpklo_s16(scale_lane_2_tmp));
                        svint32_t scale_lane_3 = svunpklo_s32(svunpklo_s16(scale_lane_3_tmp));
                        svint32_t scale_lane_4 = svunpklo_s32(svunpklo_s16(scale_lane_4_tmp));

                        isum_tmp = svmla_s32_x(pg32_8, isum_tmp, svdot_s32(vzero, q6bytes_1, q8bytes_1), scale_lane_1);
                        isum_tmp = svmla_s32_x(pg32_8, isum_tmp, svdot_s32(vzero, q6bytes_2, q8bytes_2), scale_lane_2);
                        isum_tmp = svmla_s32_x(pg32_8, isum_tmp, svdot_s32(vzero, q6bytes_3, q8bytes_3), scale_lane_3);
                        isum_tmp = svmla_s32_x(pg32_8, isum_tmp, svdot_s32(vzero, q6bytes_4, q8bytes_4), scale_lane_4);
                        scale += 8;
                    }
                    isum += svaddv_s32(pg32_8, isum_tmp);
                    sum += d_all * y[i].d * (isum - 32 * isum_mins);
                }
                break;
            default:
                assert(false && "Unsupported vector length");
                break;
        }
    }

    *s = sum;

#elif __ARM_NEON
    float sum = 0;

    const uint8x16_t m4b = vdupq_n_u8(0xF);
    const int32x4_t  vzero = vdupq_n_s32(0);
    //const int8x16_t  m32s = vdupq_n_s8(32);

    const uint8x16_t mone = vdupq_n_u8(3);

    ggml_int8x16x4_t q6bytes;
    ggml_uint8x16x4_t q6h;

    for (int i = 0; i < nb; ++i) {

        const float d_all = GGML_FP16_TO_FP32(x[i].d);

        const uint8_t * GGML_RESTRICT q6 = x[i].ql;
        const uint8_t * GGML_RESTRICT qh = x[i].qh;
        const int8_t  * GGML_RESTRICT q8 = y[i].qs;

        const int8_t * GGML_RESTRICT scale = x[i].scales;

        const ggml_int16x8x2_t q8sums = ggml_vld1q_s16_x2(y[i].bsums);
        const int8x16_t scales = vld1q_s8(scale);
        const ggml_int16x8x2_t q6scales = {{vmovl_s8(vget_low_s8(scales)), vmovl_s8(vget_high_s8(scales))}};

        const int32x4_t prod = vaddq_s32(vaddq_s32(vmull_s16(vget_low_s16 (q8sums.val[0]), vget_low_s16 (q6scales.val[0])),
                                                   vmull_s16(vget_high_s16(q8sums.val[0]), vget_high_s16(q6scales.val[0]))),
                                         vaddq_s32(vmull_s16(vget_low_s16 (q8sums.val[1]), vget_low_s16 (q6scales.val[1])),
                                                   vmull_s16(vget_high_s16(q8sums.val[1]), vget_high_s16(q6scales.val[1]))));
        int32_t isum_mins = vaddvq_s32(prod);

        int32_t isum = 0;

        for (int j = 0; j < QK_K/128; ++j) {

            ggml_uint8x16x2_t qhbits = ggml_vld1q_u8_x2(qh); qh += 32;
            ggml_uint8x16x4_t q6bits = ggml_vld1q_u8_x4(q6); q6 += 64;
            ggml_int8x16x4_t q8bytes = ggml_vld1q_s8_x4(q8); q8 += 64;

            q6h.val[0] = vshlq_n_u8(vandq_u8(mone, qhbits.val[0]), 4);
            q6h.val[1] = vshlq_n_u8(vandq_u8(mone, qhbits.val[1]), 4);
            uint8x16_t shifted = vshrq_n_u8(qhbits.val[0], 2);
            q6h.val[2] = vshlq_n_u8(vandq_u8(mone, shifted), 4);
            shifted = vshrq_n_u8(qhbits.val[1], 2);
            q6h.val[3] = vshlq_n_u8(vandq_u8(mone, shifted), 4);

            //q6bytes.val[0] = vsubq_s8(vreinterpretq_s8_u8(vorrq_u8(vandq_u8(q6bits.val[0], m4b), q6h.val[0])), m32s);
            //q6bytes.val[1] = vsubq_s8(vreinterpretq_s8_u8(vorrq_u8(vandq_u8(q6bits.val[1], m4b), q6h.val[1])), m32s);
            //q6bytes.val[2] = vsubq_s8(vreinterpretq_s8_u8(vorrq_u8(vandq_u8(q6bits.val[2], m4b), q6h.val[2])), m32s);
            //q6bytes.val[3] = vsubq_s8(vreinterpretq_s8_u8(vorrq_u8(vandq_u8(q6bits.val[3], m4b), q6h.val[3])), m32s);
            q6bytes.val[0] = vreinterpretq_s8_u8(vorrq_u8(vandq_u8(q6bits.val[0], m4b), q6h.val[0]));
            q6bytes.val[1] = vreinterpretq_s8_u8(vorrq_u8(vandq_u8(q6bits.val[1], m4b), q6h.val[1]));
            q6bytes.val[2] = vreinterpretq_s8_u8(vorrq_u8(vandq_u8(q6bits.val[2], m4b), q6h.val[2]));
            q6bytes.val[3] = vreinterpretq_s8_u8(vorrq_u8(vandq_u8(q6bits.val[3], m4b), q6h.val[3]));

            isum += vaddvq_s32(ggml_vdotq_s32(vzero, q6bytes.val[0], q8bytes.val[0])) * scale[0] +
                    vaddvq_s32(ggml_vdotq_s32(vzero, q6bytes.val[1], q8bytes.val[1])) * scale[1] +
                    vaddvq_s32(ggml_vdotq_s32(vzero, q6bytes.val[2], q8bytes.val[2])) * scale[2] +
                    vaddvq_s32(ggml_vdotq_s32(vzero, q6bytes.val[3], q8bytes.val[3])) * scale[3];

            scale += 4;

            q8bytes = ggml_vld1q_s8_x4(q8); q8 += 64;

            shifted = vshrq_n_u8(qhbits.val[0], 4);
            q6h.val[0] = vshlq_n_u8(vandq_u8(mone, shifted), 4);
            shifted = vshrq_n_u8(qhbits.val[1], 4);
            q6h.val[1] = vshlq_n_u8(vandq_u8(mone, shifted), 4);
            shifted = vshrq_n_u8(qhbits.val[0], 6);
            q6h.val[2] = vshlq_n_u8(vandq_u8(mone, shifted), 4);
            shifted = vshrq_n_u8(qhbits.val[1], 6);
            q6h.val[3] = vshlq_n_u8(vandq_u8(mone, shifted), 4);

            //q6bytes.val[0] = vsubq_s8(vreinterpretq_s8_u8(vorrq_u8(vshrq_n_u8(q6bits.val[0], 4), q6h.val[0])), m32s);
            //q6bytes.val[1] = vsubq_s8(vreinterpretq_s8_u8(vorrq_u8(vshrq_n_u8(q6bits.val[1], 4), q6h.val[1])), m32s);
            //q6bytes.val[2] = vsubq_s8(vreinterpretq_s8_u8(vorrq_u8(vshrq_n_u8(q6bits.val[2], 4), q6h.val[2])), m32s);
            //q6bytes.val[3] = vsubq_s8(vreinterpretq_s8_u8(vorrq_u8(vshrq_n_u8(q6bits.val[3], 4), q6h.val[3])), m32s);
            q6bytes.val[0] = vreinterpretq_s8_u8(vorrq_u8(vshrq_n_u8(q6bits.val[0], 4), q6h.val[0]));
            q6bytes.val[1] = vreinterpretq_s8_u8(vorrq_u8(vshrq_n_u8(q6bits.val[1], 4), q6h.val[1]));
            q6bytes.val[2] = vreinterpretq_s8_u8(vorrq_u8(vshrq_n_u8(q6bits.val[2], 4), q6h.val[2]));
            q6bytes.val[3] = vreinterpretq_s8_u8(vorrq_u8(vshrq_n_u8(q6bits.val[3], 4), q6h.val[3]));

            isum += vaddvq_s32(ggml_vdotq_s32(vzero, q6bytes.val[0], q8bytes.val[0])) * scale[0] +
                    vaddvq_s32(ggml_vdotq_s32(vzero, q6bytes.val[1], q8bytes.val[1])) * scale[1] +
                    vaddvq_s32(ggml_vdotq_s32(vzero, q6bytes.val[2], q8bytes.val[2])) * scale[2] +
                    vaddvq_s32(ggml_vdotq_s32(vzero, q6bytes.val[3], q8bytes.val[3])) * scale[3];
            scale += 4;
        }
        //sum += isum * d_all * y[i].d;
        sum += d_all * y[i].d * (isum - 32 * isum_mins);

    }
    *s = sum;

#elif defined __AVX2__

    const __m256i m4 = _mm256_set1_epi8(0xF);
    const __m256i m2 = _mm256_set1_epi8(3);
    const __m256i m32s = _mm256_set1_epi8(32);

    __m256 acc = _mm256_setzero_ps();

    for (int i = 0; i < nb; ++i) {

        const float d = y[i].d * GGML_FP16_TO_FP32(x[i].d);

        const uint8_t * GGML_RESTRICT q4 = x[i].ql;
        const uint8_t * GGML_RESTRICT qh = x[i].qh;
        const int8_t  * GGML_RESTRICT q8 = y[i].qs;

        const __m128i scales = _mm_loadu_si128((const __m128i*)x[i].scales);

        __m256i sumi = _mm256_setzero_si256();

        int is = 0;

        for (int j = 0; j < QK_K/128; ++j) {

            const __m128i scale_0 = _mm_shuffle_epi8(scales, get_scale_shuffle(is + 0));
            const __m128i scale_1 = _mm_shuffle_epi8(scales, get_scale_shuffle(is + 1));
            const __m128i scale_2 = _mm_shuffle_epi8(scales, get_scale_shuffle(is + 2));
            const __m128i scale_3 = _mm_shuffle_epi8(scales, get_scale_shuffle(is + 3));
            is += 4;

            const __m256i q4bits1 = _mm256_loadu_si256((const __m256i*)q4); q4 += 32;
            const __m256i q4bits2 = _mm256_loadu_si256((const __m256i*)q4); q4 += 32;
            const __m256i q4bitsH = _mm256_loadu_si256((const __m256i*)qh); qh += 32;

            const __m256i q4h_0 = _mm256_slli_epi16(_mm256_and_si256(q4bitsH, m2), 4);
            const __m256i q4h_1 = _mm256_slli_epi16(_mm256_and_si256(_mm256_srli_epi16(q4bitsH, 2), m2), 4);
            const __m256i q4h_2 = _mm256_slli_epi16(_mm256_and_si256(_mm256_srli_epi16(q4bitsH, 4), m2), 4);
            const __m256i q4h_3 = _mm256_slli_epi16(_mm256_and_si256(_mm256_srli_epi16(q4bitsH, 6), m2), 4);

            const __m256i q4_0 = _mm256_or_si256(_mm256_and_si256(q4bits1, m4), q4h_0);
            const __m256i q4_1 = _mm256_or_si256(_mm256_and_si256(q4bits2, m4), q4h_1);
            const __m256i q4_2 = _mm256_or_si256(_mm256_and_si256(_mm256_srli_epi16(q4bits1, 4), m4), q4h_2);
            const __m256i q4_3 = _mm256_or_si256(_mm256_and_si256(_mm256_srli_epi16(q4bits2, 4), m4), q4h_3);

            const __m256i q8_0 = _mm256_loadu_si256((const __m256i*)q8); q8 += 32;
            const __m256i q8_1 = _mm256_loadu_si256((const __m256i*)q8); q8 += 32;
            const __m256i q8_2 = _mm256_loadu_si256((const __m256i*)q8); q8 += 32;
            const __m256i q8_3 = _mm256_loadu_si256((const __m256i*)q8); q8 += 32;

            __m256i q8s_0 = _mm256_maddubs_epi16(m32s, q8_0);
            __m256i q8s_1 = _mm256_maddubs_epi16(m32s, q8_1);
            __m256i q8s_2 = _mm256_maddubs_epi16(m32s, q8_2);
            __m256i q8s_3 = _mm256_maddubs_epi16(m32s, q8_3);

            __m256i p16_0 = _mm256_maddubs_epi16(q4_0, q8_0);
            __m256i p16_1 = _mm256_maddubs_epi16(q4_1, q8_1);
            __m256i p16_2 = _mm256_maddubs_epi16(q4_2, q8_2);
            __m256i p16_3 = _mm256_maddubs_epi16(q4_3, q8_3);

            p16_0 = _mm256_sub_epi16(p16_0, q8s_0);
            p16_1 = _mm256_sub_epi16(p16_1, q8s_1);
            p16_2 = _mm256_sub_epi16(p16_2, q8s_2);
            p16_3 = _mm256_sub_epi16(p16_3, q8s_3);

            p16_0 = _mm256_madd_epi16(_mm256_cvtepi8_epi16(scale_0), p16_0);
            p16_1 = _mm256_madd_epi16(_mm256_cvtepi8_epi16(scale_1), p16_1);
            p16_2 = _mm256_madd_epi16(_mm256_cvtepi8_epi16(scale_2), p16_2);
            p16_3 = _mm256_madd_epi16(_mm256_cvtepi8_epi16(scale_3), p16_3);

            sumi = _mm256_add_epi32(sumi, _mm256_add_epi32(p16_0, p16_1));
            sumi = _mm256_add_epi32(sumi, _mm256_add_epi32(p16_2, p16_3));

        }

        acc = _mm256_fmadd_ps(_mm256_broadcast_ss(&d), _mm256_cvtepi32_ps(sumi), acc);
    }

    *s = hsum_float_8(acc);

#elif defined __AVX__

    const __m128i m3 = _mm_set1_epi8(3);
    const __m128i m15 = _mm_set1_epi8(15);

    __m256 acc = _mm256_setzero_ps();

    for (int i = 0; i < nb; ++i) {

        const float d = y[i].d * GGML_FP16_TO_FP32(x[i].d);

        const uint8_t * GGML_RESTRICT q4 = x[i].ql;
        const uint8_t * GGML_RESTRICT qh = x[i].qh;
        const int8_t  * GGML_RESTRICT q8 = y[i].qs;

        // handle the q6_k -32 offset separately using bsums
        const __m128i q8sums_0 = _mm_loadu_si128((const __m128i*)y[i].bsums);
        const __m128i q8sums_1 = _mm_loadu_si128((const __m128i*)y[i].bsums + 1);
        const __m128i scales = _mm_loadu_si128((const __m128i*)x[i].scales);
        const __m128i scales_16_0 = _mm_cvtepi8_epi16(scales);
        const __m128i scales_16_1 = _mm_cvtepi8_epi16(_mm_bsrli_si128(scales, 8));
        const __m128i q8sclsub_0 = _mm_slli_epi32(_mm_madd_epi16(q8sums_0, scales_16_0), 5);
        const __m128i q8sclsub_1 = _mm_slli_epi32(_mm_madd_epi16(q8sums_1, scales_16_1), 5);

        __m128i sumi_0 = _mm_setzero_si128();
        __m128i sumi_1 = _mm_setzero_si128();

        int is = 0;

        for (int j = 0; j < QK_K/128; ++j) {

            const __m128i q4bitsH_0 = _mm_loadu_si128((const __m128i*)qh); qh += 16;
            const __m128i q4bitsH_1 = _mm_loadu_si128((const __m128i*)qh); qh += 16;

            const __m128i q4h_0 = _mm_slli_epi16(_mm_and_si128(q4bitsH_0, m3), 4);
            const __m128i q4h_1 = _mm_slli_epi16(_mm_and_si128(q4bitsH_1, m3), 4);
            const __m128i q4h_2 = _mm_slli_epi16(_mm_and_si128(q4bitsH_0, _mm_set1_epi8(12)), 2);
            const __m128i q4h_3 = _mm_slli_epi16(_mm_and_si128(q4bitsH_1, _mm_set1_epi8(12)), 2);
            const __m128i q4h_4 = _mm_and_si128(q4bitsH_0, _mm_set1_epi8(48));
            const __m128i q4h_5 = _mm_and_si128(q4bitsH_1, _mm_set1_epi8(48));
            const __m128i q4h_6 = _mm_srli_epi16(_mm_and_si128(q4bitsH_0, _mm_set1_epi8(-64)), 2);
            const __m128i q4h_7 = _mm_srli_epi16(_mm_and_si128(q4bitsH_1, _mm_set1_epi8(-64)), 2);

            const __m128i q4bits1_0 = _mm_loadu_si128((const __m128i*)q4); q4 += 16;
            const __m128i q4bits1_1 = _mm_loadu_si128((const __m128i*)q4); q4 += 16;
            const __m128i q4bits2_0 = _mm_loadu_si128((const __m128i*)q4); q4 += 16;
            const __m128i q4bits2_1 = _mm_loadu_si128((const __m128i*)q4); q4 += 16;

            const __m128i q4_0 = _mm_or_si128(_mm_and_si128(q4bits1_0, m15), q4h_0);
            const __m128i q4_1 = _mm_or_si128(_mm_and_si128(q4bits1_1, m15), q4h_1);
            const __m128i q4_2 = _mm_or_si128(_mm_and_si128(q4bits2_0, m15), q4h_2);
            const __m128i q4_3 = _mm_or_si128(_mm_and_si128(q4bits2_1, m15), q4h_3);
            const __m128i q4_4 = _mm_or_si128(_mm_and_si128(_mm_srli_epi16(q4bits1_0, 4), m15), q4h_4);
            const __m128i q4_5 = _mm_or_si128(_mm_and_si128(_mm_srli_epi16(q4bits1_1, 4), m15), q4h_5);
            const __m128i q4_6 = _mm_or_si128(_mm_and_si128(_mm_srli_epi16(q4bits2_0, 4), m15), q4h_6);
            const __m128i q4_7 = _mm_or_si128(_mm_and_si128(_mm_srli_epi16(q4bits2_1, 4), m15), q4h_7);

            const __m128i q8_0 = _mm_loadu_si128((const __m128i*)q8); q8 += 16;
            const __m128i q8_1 = _mm_loadu_si128((const __m128i*)q8); q8 += 16;
            const __m128i q8_2 = _mm_loadu_si128((const __m128i*)q8); q8 += 16;
            const __m128i q8_3 = _mm_loadu_si128((const __m128i*)q8); q8 += 16;
            const __m128i q8_4 = _mm_loadu_si128((const __m128i*)q8); q8 += 16;
            const __m128i q8_5 = _mm_loadu_si128((const __m128i*)q8); q8 += 16;
            const __m128i q8_6 = _mm_loadu_si128((const __m128i*)q8); q8 += 16;
            const __m128i q8_7 = _mm_loadu_si128((const __m128i*)q8); q8 += 16;

            __m128i p16_0 = _mm_maddubs_epi16(q4_0, q8_0);
            __m128i p16_1 = _mm_maddubs_epi16(q4_1, q8_1);
            __m128i p16_2 = _mm_maddubs_epi16(q4_2, q8_2);
            __m128i p16_3 = _mm_maddubs_epi16(q4_3, q8_3);
            __m128i p16_4 = _mm_maddubs_epi16(q4_4, q8_4);
            __m128i p16_5 = _mm_maddubs_epi16(q4_5, q8_5);
            __m128i p16_6 = _mm_maddubs_epi16(q4_6, q8_6);
            __m128i p16_7 = _mm_maddubs_epi16(q4_7, q8_7);

            const __m128i scale_0 = _mm_shuffle_epi8(scales, get_scale_shuffle(is + 0));
            const __m128i scale_1 = _mm_shuffle_epi8(scales, get_scale_shuffle(is + 1));
            const __m128i scale_2 = _mm_shuffle_epi8(scales, get_scale_shuffle(is + 2));
            const __m128i scale_3 = _mm_shuffle_epi8(scales, get_scale_shuffle(is + 3));
            is += 4;

            p16_0 = _mm_madd_epi16(_mm_cvtepi8_epi16(scale_0), p16_0);
            p16_1 = _mm_madd_epi16(_mm_cvtepi8_epi16(_mm_bsrli_si128(scale_0, 8)), p16_1);
            p16_2 = _mm_madd_epi16(_mm_cvtepi8_epi16(scale_1), p16_2);
            p16_3 = _mm_madd_epi16(_mm_cvtepi8_epi16(_mm_bsrli_si128(scale_1, 8)), p16_3);
            p16_4 = _mm_madd_epi16(_mm_cvtepi8_epi16(scale_2), p16_4);
            p16_5 = _mm_madd_epi16(_mm_cvtepi8_epi16(_mm_bsrli_si128(scale_2, 8)), p16_5);
            p16_6 = _mm_madd_epi16(_mm_cvtepi8_epi16(scale_3), p16_6);
            p16_7 = _mm_madd_epi16(_mm_cvtepi8_epi16(_mm_bsrli_si128(scale_3, 8)), p16_7);

            sumi_0 = _mm_add_epi32(sumi_0, _mm_add_epi32(p16_0, p16_2));
            sumi_1 = _mm_add_epi32(sumi_1, _mm_add_epi32(p16_1, p16_3));
            sumi_0 = _mm_add_epi32(sumi_0, _mm_add_epi32(p16_4, p16_6));
            sumi_1 = _mm_add_epi32(sumi_1, _mm_add_epi32(p16_5, p16_7));

        }

        sumi_0 = _mm_sub_epi32(sumi_0, q8sclsub_0);
        sumi_1 = _mm_sub_epi32(sumi_1, q8sclsub_1);
        const __m256i sumi = MM256_SET_M128I(sumi_1, sumi_0);
        acc = _mm256_add_ps(_mm256_mul_ps(_mm256_set1_ps(d), _mm256_cvtepi32_ps(sumi)), acc);
    }

    *s = hsum_float_8(acc);

#elif defined __wasm_simd128__
    int8_t aux8[QK_K] __attribute__((aligned(16)));
    int32_t aux32[8] __attribute__((aligned(16))) = {0};
    float sums[8] __attribute__((aligned(16))) = {0};

    for (int i = 0; i < nb; ++i) {
        // Unpack 6-bit quantized data into aux8 (unchanged)
        const uint8_t * GGML_RESTRICT q4 = x[i].ql;
        const uint8_t * GGML_RESTRICT qh = x[i].qh;
        int8_t * a = aux8;
        for (int j = 0; j < QK_K; j += 128) {
            for (int l = 0; l < 32; ++l) {
                a[l +  0] = (int8_t)((q4[l +  0] & 0xF) | (((qh[l] >> 0) & 3) << 4)) - 32;
                a[l + 32] = (int8_t)((q4[l + 32] & 0xF) | (((qh[l] >> 2) & 3) << 4)) - 32;
                a[l + 64] = (int8_t)((q4[l +  0] >>  4) | (((qh[l] >> 4) & 3) << 4)) - 32;
                a[l + 96] = (int8_t)((q4[l + 32] >>  4) | (((qh[l] >> 6) & 3) << 4)) - 32;
            }
            a += 128;
            q4 += 64;
            qh += 32;
        }

        const int8_t * GGML_RESTRICT a_ptr = aux8;
        const int8_t * GGML_RESTRICT q8 = y[i].qs;
        v128_t acc0 = wasm_i32x4_splat(0);
        v128_t acc1 = wasm_i32x4_splat(0);

        for (int j = 0; j < QK_K/16; ++j) {
            const int scale = x[i].scales[j];
            const v128_t vscale = wasm_i32x4_splat(scale);

            // Load 16 elements from a and q8
            const v128_t a_vec = wasm_v128_load(a_ptr);
            const v128_t q8_vec = wasm_v128_load(q8);

            // Process low 8 elements
            v128_t a_low = wasm_i16x8_extend_low_i8x16(a_vec);
            v128_t q8_low = wasm_i16x8_extend_low_i8x16(q8_vec);
            v128_t prod_low = wasm_i16x8_mul(a_low, q8_low);
            v128_t prod_lo_lo = wasm_i32x4_extend_low_i16x8(prod_low);
            v128_t prod_lo_hi = wasm_i32x4_extend_high_i16x8(prod_low);

            // Process high 8 elements
            v128_t a_high = wasm_i16x8_extend_high_i8x16(a_vec);
            v128_t q8_high = wasm_i16x8_extend_high_i8x16(q8_vec);
            v128_t prod_high = wasm_i16x8_mul(a_high, q8_high);
            v128_t prod_hi_lo = wasm_i32x4_extend_low_i16x8(prod_high);
            v128_t prod_hi_hi = wasm_i32x4_extend_high_i16x8(prod_high);

            // Scale and accumulate
            prod_lo_lo = wasm_i32x4_mul(prod_lo_lo, vscale);
            prod_lo_hi = wasm_i32x4_mul(prod_lo_hi, vscale);
            prod_hi_lo = wasm_i32x4_mul(prod_hi_lo, vscale);
            prod_hi_hi = wasm_i32x4_mul(prod_hi_hi, vscale);

            acc0 = wasm_i32x4_add(acc0, wasm_i32x4_add(prod_lo_lo, prod_hi_lo));
            acc1 = wasm_i32x4_add(acc1, wasm_i32x4_add(prod_lo_hi, prod_hi_hi));

            a_ptr += 16;
            q8 += 16;
        }

        // Store accumulated results
        wasm_v128_store(&aux32[0], acc0);
        wasm_v128_store(&aux32[4], acc1);

        const float d = GGML_FP16_TO_FP32(x[i].d) * y[i].d;
        for (int l = 0; l < 8; ++l) {
            sums[l] += d * aux32[l];
        }
    }

    // Sum final results
    float sumf = 0;
    for (int l = 0; l < 8; ++l) {
        sumf += sums[l];
    }
    *s = sumf;

#elif defined __riscv_v_intrinsic

    const int vector_length = __riscv_vlenb() * 8;
    float sumf = 0;

    switch (vector_length) {
    case 256:
        for (int i = 0; i < nb; ++i) {

            const float d = GGML_FP16_TO_FP32(x[i].d) * y[i].d;

            const uint8_t * GGML_RESTRICT q6 = x[i].ql;
            const uint8_t * GGML_RESTRICT qh = x[i].qh;
            const  int8_t * GGML_RESTRICT q8 = y[i].qs;

            const int8_t * GGML_RESTRICT scale = x[i].scales;

            size_t vl;

            vint32m1_t vzero = __riscv_vmv_v_x_i32m1(0, 1);

            int sum_t = 0;
            int is = 0;

            for (int j = 0; j < QK_K/128; ++j) {

                vl = 32;

                // load qh
                vuint8m1_t qh_x = __riscv_vle8_v_u8m1(qh, vl);

                // load Q6
                vuint8m1_t q6_0 = __riscv_vle8_v_u8m1(q6, vl);
                vuint8m1_t q6_1 = __riscv_vle8_v_u8m1(q6+32, vl);

                vuint8m1_t q6a_0 = __riscv_vand_vx_u8m1(q6_0, 0x0F, vl);
                vuint8m1_t q6a_1 = __riscv_vand_vx_u8m1(q6_1, 0x0F, vl);
                vuint8m1_t q6s_0 = __riscv_vsrl_vx_u8m1(q6_0, 0x04, vl);
                vuint8m1_t q6s_1 = __riscv_vsrl_vx_u8m1(q6_1, 0x04, vl);

                vuint8m1_t qh_0 = __riscv_vand_vx_u8m1(qh_x, 0x03, vl);
                vuint8m1_t qh_1 = __riscv_vand_vx_u8m1(__riscv_vsrl_vx_u8m1(qh_x, 0x2, vl), 0x03 , vl);
                vuint8m1_t qh_2 = __riscv_vand_vx_u8m1(__riscv_vsrl_vx_u8m1(qh_x, 0x4, vl), 0x03 , vl);
                vuint8m1_t qh_3 = __riscv_vand_vx_u8m1(__riscv_vsrl_vx_u8m1(qh_x, 0x6, vl), 0x03 , vl);

                vuint8m1_t qhi_0 = __riscv_vor_vv_u8m1(q6a_0, __riscv_vsll_vx_u8m1(qh_0, 0x04, vl), vl);
                vuint8m1_t qhi_1 = __riscv_vor_vv_u8m1(q6a_1, __riscv_vsll_vx_u8m1(qh_1, 0x04, vl), vl);
                vuint8m1_t qhi_2 = __riscv_vor_vv_u8m1(q6s_0, __riscv_vsll_vx_u8m1(qh_2, 0x04, vl), vl);
                vuint8m1_t qhi_3 = __riscv_vor_vv_u8m1(q6s_1, __riscv_vsll_vx_u8m1(qh_3, 0x04, vl), vl);

                vint8m1_t a_0 = __riscv_vsub_vx_i8m1(__riscv_vreinterpret_v_u8m1_i8m1(qhi_0), 32, vl);
                vint8m1_t a_1 = __riscv_vsub_vx_i8m1(__riscv_vreinterpret_v_u8m1_i8m1(qhi_1), 32, vl);
                vint8m1_t a_2 = __riscv_vsub_vx_i8m1(__riscv_vreinterpret_v_u8m1_i8m1(qhi_2), 32, vl);
                vint8m1_t a_3 = __riscv_vsub_vx_i8m1(__riscv_vreinterpret_v_u8m1_i8m1(qhi_3), 32, vl);

                // load Q8 and take product
                vint16m2_t va_q_0 = __riscv_vwmul_vv_i16m2(a_0, __riscv_vle8_v_i8m1(q8, vl), vl);
                vint16m2_t va_q_1 = __riscv_vwmul_vv_i16m2(a_1, __riscv_vle8_v_i8m1(q8+32, vl), vl);
                vint16m2_t va_q_2 = __riscv_vwmul_vv_i16m2(a_2, __riscv_vle8_v_i8m1(q8+64, vl), vl);
                vint16m2_t va_q_3 = __riscv_vwmul_vv_i16m2(a_3, __riscv_vle8_v_i8m1(q8+96, vl), vl);

                vl = 16;

                vint32m2_t vaux_0 = __riscv_vwmul_vx_i32m2(__riscv_vget_v_i16m2_i16m1(va_q_0, 0), scale[is+0], vl);
                vint32m2_t vaux_1 = __riscv_vwmul_vx_i32m2(__riscv_vget_v_i16m2_i16m1(va_q_0, 1), scale[is+1], vl);
                vint32m2_t vaux_2 = __riscv_vwmul_vx_i32m2(__riscv_vget_v_i16m2_i16m1(va_q_1, 0), scale[is+2], vl);
                vint32m2_t vaux_3 = __riscv_vwmul_vx_i32m2(__riscv_vget_v_i16m2_i16m1(va_q_1, 1), scale[is+3], vl);
                vint32m2_t vaux_4 = __riscv_vwmul_vx_i32m2(__riscv_vget_v_i16m2_i16m1(va_q_2, 0), scale[is+4], vl);
                vint32m2_t vaux_5 = __riscv_vwmul_vx_i32m2(__riscv_vget_v_i16m2_i16m1(va_q_2, 1), scale[is+5], vl);
                vint32m2_t vaux_6 = __riscv_vwmul_vx_i32m2(__riscv_vget_v_i16m2_i16m1(va_q_3, 0), scale[is+6], vl);
                vint32m2_t vaux_7 = __riscv_vwmul_vx_i32m2(__riscv_vget_v_i16m2_i16m1(va_q_3, 1), scale[is+7], vl);

                vint32m1_t isum0 = __riscv_vredsum_vs_i32m2_i32m1(__riscv_vadd_vv_i32m2(vaux_0, vaux_1, vl), vzero, vl);
                vint32m1_t isum1 = __riscv_vredsum_vs_i32m2_i32m1(__riscv_vadd_vv_i32m2(vaux_2, vaux_3, vl), isum0, vl);
                vint32m1_t isum2 = __riscv_vredsum_vs_i32m2_i32m1(__riscv_vadd_vv_i32m2(vaux_4, vaux_5, vl), isum1, vl);
                vint32m1_t isum3 = __riscv_vredsum_vs_i32m2_i32m1(__riscv_vadd_vv_i32m2(vaux_6, vaux_7, vl), isum2, vl);

                sum_t += __riscv_vmv_x_s_i32m1_i32(isum3);

                q6 += 64;   qh += 32;   q8 += 128;   is=8;

            }

            sumf += d * sum_t;

        }
        break;
    case 128:
        for (int i = 0; i < nb; ++i) {

            const float d = GGML_FP16_TO_FP32(x[i].d) * y[i].d;

            const uint8_t * restrict q6 = x[i].ql;
            const uint8_t * restrict qh = x[i].qh;
            const  int8_t * restrict q8 = y[i].qs;

            const int8_t * restrict scale = x[i].scales;

            int sum_t = 0;
            int t0;

            for (int j = 0; j < QK_K/128; ++j) {
                __asm__ __volatile__(
                    "vsetvli zero, %[vl32], e8, m2\n\t"
                    "vle8.v v4, (%[qh])\n\t"
                    "vsll.vi v0, v4, 4\n\t"
                    "vsll.vi v2, v4, 2\n\t"
                    "vsrl.vi v6, v4, 2\n\t"
                    "vsetvli zero, %[vl64], e8, m4\n\t"
                    "vle8.v v8, (%[q6])\n\t"
                    "vsrl.vi v12, v8, 4\n\t"
                    "vand.vi v8, v8, 0xF\n\t"
                    "vsetvli zero, %[vl128], e8, m8\n\t"
                    "vand.vx v0, v0, %[mask]\n\t"
                    "vor.vv v8, v8, v0\n\t"
                    "vle8.v v0, (%[q8])\n\t"
                    "vsub.vx v8, v8, %[vl32]\n\t"
                    "vsetvli zero, %[vl64], e8, m4\n\t"
                    "vwmul.vv v16, v0, v8\n\t"
                    "vwmul.vv v24, v4, v12\n\t"
                    "vsetivli zero, 16, e16, m2\n\t"
                    "vmv.v.x v0, zero\n\t"
                    "vwredsum.vs v10, v16, v0\n\t"
                    "vwredsum.vs v9, v18, v0\n\t"
                    "vwredsum.vs v8, v20, v0\n\t"
                    "vwredsum.vs v7, v22, v0\n\t"
                    "vwredsum.vs v11, v24, v0\n\t"
                    "vwredsum.vs v12, v26, v0\n\t"
                    "vwredsum.vs v13, v28, v0\n\t"
                    "vwredsum.vs v14, v30, v0\n\t"
                    "vsetivli zero, 4, e32, m1\n\t"
                    "vslideup.vi v10, v9, 1\n\t"
                    "vslideup.vi v8, v7, 1\n\t"
                    "vslideup.vi v11, v12, 1\n\t"
                    "vslideup.vi v13, v14, 1\n\t"
                    "vslideup.vi v10, v8, 2\n\t"
                    "vslideup.vi v11, v13, 2\n\t"
                    "vsetivli zero, 8, e32, m2\n\t"
                    "vle8.v v2, (%[scale])\n\t"
                    "vsext.vf4 v4, v2\n\t"
                    "vmul.vv v2, v4, v10\n\t"
                    "vredsum.vs v0, v2, v0\n\t"
                    "vmv.x.s %[t0], v0\n\t"
                    "add %[sumi], %[sumi], %[t0]"
                    : [sumi] "+&r" (sum_t), [t0] "=&r" (t0)
                    : [qh] "r" (qh), [q6] "r" (q6), [q8] "r" (q8), [scale] "r" (scale)
                    , [vl32] "r" (32), [vl64] "r" (64), [vl128] "r" (128)
                    , [mask] "r" (0x30)
                    : "memory"
                    , "v0", "v1", "v2", "v3", "v4", "v5", "v6", "v7"
                    , "v8", "v9", "v10", "v11", "v12", "v13", "v14", "v15"
                    , "v16", "v17", "v18", "v19", "v20", "v21", "v22", "v23"
                    , "v24", "v25", "v26", "v27", "v28", "v29", "v30", "v31"
                );
                q6 += 64;   qh += 32;   q8 += 128;   scale += 8;
            }

            sumf += d * sum_t;

        }
        break;
    default:
        assert(false && "Unsupported vector length");
        break;
    }

    *s = sumf;

#elif defined(__POWER9_VECTOR__)
    const vector signed char lowMask = vec_splats((signed char)0xF);
    const vector int v0 = vec_splats((int32_t)0);
    const vector unsigned char v2 = vec_splats((unsigned char)0x2);
    const vector unsigned char v3 = vec_splats((unsigned char)0x3);
    const vector unsigned char v4 = vec_splats((unsigned char)0x4);
    const vector unsigned char v6 = vec_splats((unsigned char)0x6);
    const vector signed char off = vec_splats((signed char)0x20);

    vector float vsumf0 = vec_splats(0.0f);
    vector float vsumf1 = vec_splats(0.0f);
    vector float vsumf2 = vec_splats(0.0f);
    vector float vsumf3 = vec_splats(0.0f);

    for (int i = 0; i < nb; ++i) {
        vector float vxd = vec_splats(GGML_FP16_TO_FP32(x[i].d));
        vector float vyd = vec_splats(y[i].d);
        vector float vd = vec_mul(vxd, vyd);

        vector signed int vsumi0 = v0;
        vector signed int vsumi1 = v0;
        vector signed int vsumi2 = v0;
        vector signed int vsumi3 = v0;
        vector signed int vsumi4 = v0;
        vector signed int vsumi5 = v0;
        vector signed int vsumi6 = v0;
        vector signed int vsumi7 = v0;

        const uint8_t * GGML_RESTRICT q6 = x[i].ql;
        const uint8_t * GGML_RESTRICT qh = x[i].qh;
        const int8_t  * GGML_RESTRICT qs = x[i].scales;
        const int8_t  * GGML_RESTRICT q8 = y[i].qs;

        for (int j = 0; j < QK_K/128; ++j) {
            __builtin_prefetch(q6, 0, 0);
            __builtin_prefetch(qh, 0, 0);
            __builtin_prefetch(q8, 0, 0);

            vector signed char qxs0 = (vector signed char)vec_xl( 0, q6);
            vector signed char qxs1 = (vector signed char)vec_xl(16, q6);
            vector signed char qxs2 = (vector signed char)vec_xl(32, q6);
            vector signed char qxs3 = (vector signed char)vec_xl(48, q6);
            q6 += 64;

            vector signed char qxs00 = vec_and(qxs0, lowMask);
            vector signed char qxs01 = vec_sr(qxs0, v4);
            vector signed char qxs10 = vec_and(qxs1, lowMask);
            vector signed char qxs11 = vec_sr(qxs1, v4);
            vector signed char qxs20 = vec_and(qxs2, lowMask);
            vector signed char qxs21 = vec_sr(qxs2, v4);
            vector signed char qxs30 = vec_and(qxs3, lowMask);
            vector signed char qxs31 = vec_sr(qxs3, v4);

            vector signed char qxhs0 = (vector signed char)vec_xl( 0, qh);
            vector signed char qxhs1 = (vector signed char)vec_xl(16, qh);
            qh += 32;

            vector signed char qxh00 = vec_sl(vec_and((vector signed char)v3, qxhs0), v4);
            vector signed char qxh01 = vec_sl(vec_and((vector signed char)v3, vec_sr(qxhs0, v4)), v4);
            vector signed char qxh10 = vec_sl(vec_and((vector signed char)v3, qxhs1), v4);
            vector signed char qxh11 = vec_sl(vec_and((vector signed char)v3, vec_sr(qxhs1, v4)), v4);
            vector signed char qxh20 = vec_sl(vec_and((vector signed char)v3, vec_sr(qxhs0, v2)), v4);
            vector signed char qxh21 = vec_sl(vec_and((vector signed char)v3, vec_sr(qxhs0, v6)), v4);
            vector signed char qxh30 = vec_sl(vec_and((vector signed char)v3, vec_sr(qxhs1, v2)), v4);
            vector signed char qxh31 = vec_sl(vec_and((vector signed char)v3, vec_sr(qxhs1, v6)), v4);

            vector signed char q6x00 = vec_sub(vec_or(qxh00, qxs00), off);
            vector signed char q6x01 = vec_sub(vec_or(qxh01, qxs01), off);
            vector signed char q6x10 = vec_sub(vec_or(qxh10, qxs10), off);
            vector signed char q6x11 = vec_sub(vec_or(qxh11, qxs11), off);
            vector signed char q6x20 = vec_sub(vec_or(qxh20, qxs20), off);
            vector signed char q6x21 = vec_sub(vec_or(qxh21, qxs21), off);
            vector signed char q6x30 = vec_sub(vec_or(qxh30, qxs30), off);
            vector signed char q6x31 = vec_sub(vec_or(qxh31, qxs31), off);

            vector signed char q8y00 = vec_xl(  0, q8);
            vector signed char q8y10 = vec_xl( 16, q8);
            vector signed char q8y20 = vec_xl( 32, q8);
            vector signed char q8y30 = vec_xl( 48, q8);
            vector signed char q8y01 = vec_xl( 64, q8);
            vector signed char q8y11 = vec_xl( 80, q8);
            vector signed char q8y21 = vec_xl( 96, q8);
            vector signed char q8y31 = vec_xl(112, q8);
            q8 += 128;

            vector signed short qv00 = vec_add(vec_mule(q6x00, q8y00), vec_mulo(q6x00, q8y00));
            vector signed short qv10 = vec_add(vec_mule(q6x10, q8y10), vec_mulo(q6x10, q8y10));
            vector signed short qv20 = vec_add(vec_mule(q6x20, q8y20), vec_mulo(q6x20, q8y20));
            vector signed short qv30 = vec_add(vec_mule(q6x30, q8y30), vec_mulo(q6x30, q8y30));
            vector signed short qv01 = vec_add(vec_mule(q6x01, q8y01), vec_mulo(q6x01, q8y01));
            vector signed short qv11 = vec_add(vec_mule(q6x11, q8y11), vec_mulo(q6x11, q8y11));
            vector signed short qv21 = vec_add(vec_mule(q6x21, q8y21), vec_mulo(q6x21, q8y21));
            vector signed short qv31 = vec_add(vec_mule(q6x31, q8y31), vec_mulo(q6x31, q8y31));

            vector signed short vscales = vec_unpackh(vec_xl_len(qs, 8));
            qs += 8;

            vector signed short vs0 = vec_splat(vscales, 0);
            vector signed short vs1 = vec_splat(vscales, 1);
            vector signed short vs2 = vec_splat(vscales, 2);
            vector signed short vs3 = vec_splat(vscales, 3);
            vector signed short vs4 = vec_splat(vscales, 4);
            vector signed short vs5 = vec_splat(vscales, 5);
            vector signed short vs6 = vec_splat(vscales, 6);
            vector signed short vs7 = vec_splat(vscales, 7);

            vsumi0 = vec_msum(qv00, vs0, vsumi0);
            vsumi1 = vec_msum(qv01, vs4, vsumi1);
            vsumi2 = vec_msum(qv10, vs1, vsumi2);
            vsumi3 = vec_msum(qv11, vs5, vsumi3);
            vsumi4 = vec_msum(qv20, vs2, vsumi4);
            vsumi5 = vec_msum(qv21, vs6, vsumi5);
            vsumi6 = vec_msum(qv30, vs3, vsumi6);
            vsumi7 = vec_msum(qv31, vs7, vsumi7);
        }

        vsumi0 = vec_add(vsumi0, vsumi4);
        vsumi1 = vec_add(vsumi1, vsumi5);
        vsumi2 = vec_add(vsumi2, vsumi6);
        vsumi3 = vec_add(vsumi3, vsumi7);

        vsumf0 = vec_madd(vec_ctf(vsumi0, 0), vd, vsumf0);
        vsumf1 = vec_madd(vec_ctf(vsumi1, 0), vd, vsumf1);
        vsumf2 = vec_madd(vec_ctf(vsumi2, 0), vd, vsumf2);
        vsumf3 = vec_madd(vec_ctf(vsumi3, 0), vd, vsumf3);
    }

    vsumf0 = vec_add(vsumf0, vsumf2);
    vsumf1 = vec_add(vsumf1, vsumf3);

    vsumf0 = vec_add(vsumf0, vsumf1);

    vsumf0 = vec_add(vsumf0, vec_sld(vsumf0, vsumf0, 4));
    vsumf0 = vec_add(vsumf0, vec_sld(vsumf0, vsumf0, 8));

    *s = vec_extract(vsumf0, 0);

#elif defined __loongarch_asx

    const __m256i m32s = __lasx_xvreplgr2vr_b(32);

    __m256 acc = (__m256)__lasx_xvldi(0);

    for (int i = 0; i < nb; ++i) {

        const float d = y[i].d * GGML_FP16_TO_FP32(x[i].d);

        const uint8_t * GGML_RESTRICT q4 = x[i].ql;
        const uint8_t * GGML_RESTRICT qh = x[i].qh;
        const int8_t  * GGML_RESTRICT q8 = y[i].qs;

        const __m128i scales128 = __lsx_vld((const __m128i*)x[i].scales, 0);
        const v16i8 shuffle_mask = {0, 2, 4, 6, 8, 10, 12, 14, 1, 3, 5, 7, 9, 11, 13, 15};
        const __m256i scales_shuffled = lasx_ext8_16(__lsx_vshuf_b(scales128, scales128, (__m128i)shuffle_mask));

        __m256i sumi = __lasx_xvldi(0);

        for (int j = 0; j < QK_K/128; ++j) {

            const __m256i q4bits1 = __lasx_xvld((const __m256i*)q4, 0); q4 += 32;
            const __m256i q4bits2 = __lasx_xvld((const __m256i*)q4, 0); q4 += 32;
            const __m256i q4bitsH = __lasx_xvld((const __m256i*)qh, 0); qh += 32;

            const __m256i q4h_0 = __lasx_xvslli_b(__lasx_xvandi_b(q4bitsH, 3), 4);
            const __m256i q4h_1 = __lasx_xvslli_b(__lasx_xvandi_b(q4bitsH, 3 << 2), 2);
            const __m256i q4h_2 = __lasx_xvandi_b(q4bitsH, 3 << 4);
            const __m256i q4h_3 = __lasx_xvsrli_b(__lasx_xvandi_b(q4bitsH, 3 << 6), 2);

            const __m256i q4_0 = __lasx_xvor_v(__lasx_xvandi_b(q4bits1, 0xf), q4h_0);
            const __m256i q4_1 = __lasx_xvor_v(__lasx_xvandi_b(q4bits2, 0xf), q4h_1);
            const __m256i q4_2 = __lasx_xvor_v(__lasx_xvsrli_b(q4bits1, 4), q4h_2);
            const __m256i q4_3 = __lasx_xvor_v(__lasx_xvsrli_b(q4bits2, 4), q4h_3);

            const __m256i q8_0 = __lasx_xvld((const __m256i*)q8, 0); q8 += 32;
            const __m256i q8_1 = __lasx_xvld((const __m256i*)q8, 0); q8 += 32;
            const __m256i q8_2 = __lasx_xvld((const __m256i*)q8, 0); q8 += 32;
            const __m256i q8_3 = __lasx_xvld((const __m256i*)q8, 0); q8 += 32;

            __m256i p16_0 = lasx_madd_h_b(__lasx_xvsub_b(q4_0, m32s), q8_0);
            __m256i p16_1 = lasx_madd_h_b(__lasx_xvsub_b(q4_1, m32s), q8_1);
            __m256i p16_2 = lasx_madd_h_b(__lasx_xvsub_b(q4_2, m32s), q8_2);
            __m256i p16_3 = lasx_madd_h_b(__lasx_xvsub_b(q4_3, m32s), q8_3);

            p16_0 = lasx_madd_h(lasx_xvrepl128vei_h(scales_shuffled, 4 * j + 0), p16_0);
            p16_1 = lasx_madd_h(lasx_xvrepl128vei_h(scales_shuffled, 4 * j + 1), p16_1);
            p16_2 = lasx_madd_h(lasx_xvrepl128vei_h(scales_shuffled, 4 * j + 2), p16_2);
            p16_3 = lasx_madd_h(lasx_xvrepl128vei_h(scales_shuffled, 4 * j + 3), p16_3);

            sumi = __lasx_xvadd_w(sumi, __lasx_xvadd_w(p16_0, p16_1));
            sumi = __lasx_xvadd_w(sumi, __lasx_xvadd_w(p16_2, p16_3));
        }

        acc = __lasx_xvfmadd_s((__m256)__lasx_xvreplfr2vr_s(d), __lasx_xvffint_s_w(sumi), acc);
    }

    *s = hsum_float_8(acc);
#elif defined(__VXE__) || defined(__VXE2__)
    float sum = 0;

    // Lower 4-bit and upper 2-bit masks
    const uint8x16_t v_lm = vec_splat_u8(0x0F);
    const uint8x16_t v_um = vec_splat_u8(0x03);

    const int32x4_t v_z = vec_splat_s32(0);

    int8x16_t  q6b[4];
    uint8x16_t q6h[4];

    uint8x16_t v_xl[4];
    uint8x16_t v_xh[2];
    int8x16_t  v_y[4];

    for (int i = 0; i < nb; ++i) {
        const float d_all = GGML_FP16_TO_FP32(x[i].d);

        const uint8_t * GGML_RESTRICT x0l = x[i].ql;
        const uint8_t * GGML_RESTRICT x0h = x[i].qh;
        const int8_t  * GGML_RESTRICT y0 = y[i].qs;

        const int8_t  * GGML_RESTRICT scale = x[i].scales;

        const int16x8_t v_ysumsl = vec_xl(0 , y[i].bsums);
        const int16x8_t v_ysumsh = vec_xl(16, y[i].bsums);

        const int8x16_t v_scale  = vec_xl(0, scale);
        const int16x8_t v_scalel = vec_unpackh(v_scale);
        const int16x8_t v_scaleh = vec_unpackl(v_scale);

        const int32x4_t v_minslo = vec_mulo(v_ysumsl, v_scalel);
        const int32x4_t v_minsle = vec_mule(v_ysumsl, v_scalel);
        const int32x4_t v_minsho = vec_mulo(v_ysumsh, v_scaleh);
        const int32x4_t v_minshe = vec_mule(v_ysumsh, v_scaleh);
        const int32x4_t v_mins = v_minslo + v_minsle + v_minsho + v_minshe;

        const int32_t mins = v_mins[0] + v_mins[1] + v_mins[2] + v_mins[3];

        int32_t isum = 0;
        for (int j = 0; j < QK_K/128; ++j) {
            // Load model upper 2 bits
            v_xh[0] = vec_xl(0 , x0h);
            v_xh[1] = vec_xl(16, x0h);
            x0h += 32;

            // Load model lower 4 bits
            v_xl[0] = vec_xl(0 , x0l);
            v_xl[1] = vec_xl(16, x0l);
            v_xl[2] = vec_xl(32, x0l);
            v_xl[3] = vec_xl(48, x0l);
            x0l += 64;

            // Load activation quants
            v_y[0] = vec_xl(0 , y0);
            v_y[1] = vec_xl(16, y0);
            v_y[2] = vec_xl(32, y0);
            v_y[3] = vec_xl(48, y0);
            y0 += 64;

            q6h[0] = vec_sl(vec_and(v_um, v_xh[0]), 4);
            q6h[1] = vec_sl(vec_and(v_um, v_xh[1]), 4);
            uint8x16_t shifted = vec_sr(v_xh[0], 2);
            q6h[2] = vec_sl(vec_and(v_um, shifted), 4);
            shifted = vec_sr(v_xh[1], 2);
            q6h[3] = vec_sl(vec_and(v_um, shifted), 4);

            q6b[0] = (int8x16_t)(vec_or(vec_and(v_xl[0], v_lm), q6h[0]));
            q6b[1] = (int8x16_t)(vec_or(vec_and(v_xl[1], v_lm), q6h[1]));
            q6b[2] = (int8x16_t)(vec_or(vec_and(v_xl[2], v_lm), q6h[2]));
            q6b[3] = (int8x16_t)(vec_or(vec_and(v_xl[3], v_lm), q6h[3]));

            int32x4_t summs0 = ggml_vec_dot(v_z, q6b[0], v_y[0]);
            int32x4_t summs1 = ggml_vec_dot(v_z, q6b[1], v_y[1]);
            int32x4_t summs2 = ggml_vec_dot(v_z, q6b[2], v_y[2]);
            int32x4_t summs3 = ggml_vec_dot(v_z, q6b[3], v_y[3]);

            isum += (summs0[0] + summs0[1] + summs0[2] + summs0[3]) * scale[0] +
                    (summs1[0] + summs1[1] + summs1[2] + summs1[3]) * scale[1] +
                    (summs2[0] + summs2[1] + summs2[2] + summs2[3]) * scale[2] +
                    (summs3[0] + summs3[1] + summs3[2] + summs3[3]) * scale[3];

            scale += 4;


            // Load activation quants
            v_y[0] = vec_xl(0 , y0);
            v_y[1] = vec_xl(16, y0);
            v_y[2] = vec_xl(32, y0);
            v_y[3] = vec_xl(48, y0);
            y0 += 64;

            shifted = vec_sr(v_xh[0], 4);
            q6h[0] = vec_sl(vec_and(v_um, shifted), 4);
            shifted = vec_sr(v_xh[1], 4);
            q6h[1] = vec_sl(vec_and(v_um, shifted), 4);
            shifted = vec_sr(v_xh[0], 6);
            q6h[2] = vec_sl(vec_and(v_um, shifted), 4);
            shifted = vec_sr(v_xh[1], 6);
            q6h[3] = vec_sl(vec_and(v_um, shifted), 4);

            q6b[0] = (int8x16_t)(vec_or(vec_sr(v_xl[0], 4), q6h[0]));
            q6b[1] = (int8x16_t)(vec_or(vec_sr(v_xl[1], 4), q6h[1]));
            q6b[2] = (int8x16_t)(vec_or(vec_sr(v_xl[2], 4), q6h[2]));
            q6b[3] = (int8x16_t)(vec_or(vec_sr(v_xl[3], 4), q6h[3]));

            summs0 = ggml_vec_dot(v_z, q6b[0], v_y[0]);
            summs1 = ggml_vec_dot(v_z, q6b[1], v_y[1]);
            summs2 = ggml_vec_dot(v_z, q6b[2], v_y[2]);
            summs3 = ggml_vec_dot(v_z, q6b[3], v_y[3]);

            isum += (summs0[0] + summs0[1] + summs0[2] + summs0[3]) * scale[0] +
                    (summs1[0] + summs1[1] + summs1[2] + summs1[3]) * scale[1] +
                    (summs2[0] + summs2[1] + summs2[2] + summs2[3]) * scale[2] +
                    (summs3[0] + summs3[1] + summs3[2] + summs3[3]) * scale[3];

            scale += 4;
        }

        sum += d_all * y[i].d * (isum - 32 * mins);
    }

    *s = sum;
#else

    int8_t  aux8[QK_K];
    int16_t aux16[8];
    float   sums [8];
    int32_t aux32[8];
    memset(sums, 0, 8*sizeof(float));

    float sumf = 0;
    for (int i = 0; i < nb; ++i) {
        const uint8_t * GGML_RESTRICT q4 = x[i].ql;
        const uint8_t * GGML_RESTRICT qh = x[i].qh;
        const  int8_t * GGML_RESTRICT q8 = y[i].qs;
        memset(aux32, 0, 8*sizeof(int32_t));
        int8_t * GGML_RESTRICT a = aux8;
        for (int j = 0; j < QK_K; j += 128) {
            for (int l = 0; l < 32; ++l) {
                a[l +  0] = (int8_t)((q4[l +  0] & 0xF) | (((qh[l] >> 0) & 3) << 4)) - 32;
                a[l + 32] = (int8_t)((q4[l + 32] & 0xF) | (((qh[l] >> 2) & 3) << 4)) - 32;
                a[l + 64] = (int8_t)((q4[l +  0] >>  4) | (((qh[l] >> 4) & 3) << 4)) - 32;
                a[l + 96] = (int8_t)((q4[l + 32] >>  4) | (((qh[l] >> 6) & 3) << 4)) - 32;
            }
            a  += 128;
            q4 += 64;
            qh += 32;
        }
        a = aux8;
        int is = 0;
        for (int j = 0; j < QK_K/16; ++j) {
            int scale = x[i].scales[is++];
            for (int l = 0; l < 8; ++l) aux16[l] = q8[l] * a[l];
            for (int l = 0; l < 8; ++l) aux32[l] += scale * aux16[l];
            q8 += 8; a += 8;
            for (int l = 0; l < 8; ++l) aux16[l] = q8[l] * a[l];
            for (int l = 0; l < 8; ++l) aux32[l] += scale * aux16[l];
            q8 += 8; a += 8;
        }
        const float d = GGML_FP16_TO_FP32(x[i].d) * y[i].d;
        for (int l = 0; l < 8; ++l) sums[l] += d * aux32[l];
    }
    for (int l = 0; l < 8; ++l) sumf += sums[l];
    *s = sumf;
#endif
}